

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiIntersectorK<4,16>::
     occluded_hn<embree::avx512::OrientedCurve1IntersectorK<embree::HermiteCurveT,16>,embree::avx512::Occluded1KEpilog1<16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  Primitive PVar3;
  uint uVar4;
  Geometry *pGVar5;
  long lVar6;
  __int_type_conflict _Var7;
  RTCFilterFunctionN p_Var8;
  undefined8 uVar9;
  undefined8 uVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  byte bVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  long lVar21;
  uint uVar22;
  bool bVar23;
  bool bVar24;
  ulong uVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar75 [64];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar81 [64];
  undefined1 auVar83 [64];
  undefined1 auVar44 [16];
  undefined1 auVar85 [64];
  undefined1 auVar87 [64];
  undefined1 auVar89 [64];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  int iVar95;
  float fVar96;
  undefined4 uVar97;
  float fVar104;
  vint4 bi_2;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [64];
  vint4 bi_1;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [32];
  vfloat4 b0;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  vint4 ai_2;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [32];
  vint4 bi;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [32];
  vint4 ai;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  float fVar157;
  float fVar169;
  vint4 ai_1;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  float fVar170;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  float fVar180;
  float fVar186;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [32];
  float fVar187;
  float fVar199;
  float fVar200;
  __m128 a;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  float fVar201;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar212;
  float fVar213;
  float fVar214;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  float fVar215;
  float fVar223;
  float fVar224;
  vfloat4 a0_1;
  float fVar225;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  vfloat4 a0;
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [64];
  undefined1 in_ZMM19 [64];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  int iVar239;
  undefined1 in_ZMM30 [64];
  undefined1 auVar240 [64];
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  vint<16> mask;
  BBox1f cv_stack [4];
  bool local_771;
  float local_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  uint auStack_600 [4];
  RTCFilterFunctionNArguments local_5f0;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [16];
  undefined1 local_590 [16];
  undefined1 local_580 [16];
  undefined1 local_570 [8];
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  undefined1 local_550 [16];
  undefined1 local_540 [16];
  undefined1 local_530 [8];
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [16];
  undefined1 local_510 [8];
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [16];
  undefined1 local_490 [16];
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  uint uStack_460;
  float afStack_45c [7];
  undefined1 local_440 [64];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  ulong auStack_3a0 [4];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  ulong uVar17;
  undefined1 auVar80 [64];
  undefined1 auVar82 [64];
  undefined1 auVar84 [64];
  undefined1 auVar86 [64];
  undefined1 auVar88 [64];
  undefined1 auVar90 [64];
  
  PVar3 = prim[1];
  uVar16 = (ulong)(byte)PVar3;
  fVar96 = *(float *)(prim + uVar16 * 0x19 + 0x12);
  auVar29 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar29 = vinsertps_avx(auVar29,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar30 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar30 = vinsertps_avx(auVar30,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar29 = vsubps_avx(auVar29,*(undefined1 (*) [16])(prim + uVar16 * 0x19 + 6));
  auVar43._0_4_ = fVar96 * auVar29._0_4_;
  auVar43._4_4_ = fVar96 * auVar29._4_4_;
  auVar43._8_4_ = fVar96 * auVar29._8_4_;
  auVar43._12_4_ = fVar96 * auVar29._12_4_;
  auVar29 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar16 * 4 + 6)));
  auVar38._0_4_ = fVar96 * auVar30._0_4_;
  auVar38._4_4_ = fVar96 * auVar30._4_4_;
  auVar38._8_4_ = fVar96 * auVar30._8_4_;
  auVar38._12_4_ = fVar96 * auVar30._12_4_;
  auVar29 = vcvtdq2ps_avx(auVar29);
  auVar30 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar16 * 5 + 6)));
  auVar30 = vcvtdq2ps_avx(auVar30);
  auVar26 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar16 * 6 + 6)));
  auVar26 = vcvtdq2ps_avx(auVar26);
  auVar31 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar16 * 0xb + 6)));
  auVar31 = vcvtdq2ps_avx(auVar31);
  auVar39 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6)));
  auVar39 = vcvtdq2ps_avx(auVar39);
  auVar27 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar3 * 0xc + uVar16 + 6)));
  uVar25 = (ulong)(uint)((int)(uVar16 * 9) * 2);
  auVar33 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar25 + 6)));
  auVar27 = vcvtdq2ps_avx(auVar27);
  auVar33 = vcvtdq2ps_avx(auVar33);
  auVar32 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar25 + uVar16 + 6)));
  auVar32 = vcvtdq2ps_avx(auVar32);
  uVar20 = (ulong)(uint)((int)(uVar16 * 5) << 2);
  auVar28 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar20 + 6)));
  auVar28 = vcvtdq2ps_avx(auVar28);
  auVar48._4_4_ = auVar38._0_4_;
  auVar48._0_4_ = auVar38._0_4_;
  auVar48._8_4_ = auVar38._0_4_;
  auVar48._12_4_ = auVar38._0_4_;
  auVar34 = vshufps_avx(auVar38,auVar38,0x55);
  auVar35 = vshufps_avx(auVar38,auVar38,0xaa);
  fVar96 = auVar35._0_4_;
  auVar50._0_4_ = fVar96 * auVar26._0_4_;
  fVar104 = auVar35._4_4_;
  auVar50._4_4_ = fVar104 * auVar26._4_4_;
  fVar203 = auVar35._8_4_;
  auVar50._8_4_ = fVar203 * auVar26._8_4_;
  fVar187 = auVar35._12_4_;
  auVar50._12_4_ = fVar187 * auVar26._12_4_;
  auVar41._0_4_ = auVar27._0_4_ * fVar96;
  auVar41._4_4_ = auVar27._4_4_ * fVar104;
  auVar41._8_4_ = auVar27._8_4_ * fVar203;
  auVar41._12_4_ = auVar27._12_4_ * fVar187;
  auVar98._0_4_ = auVar28._0_4_ * fVar96;
  auVar98._4_4_ = auVar28._4_4_ * fVar104;
  auVar98._8_4_ = auVar28._8_4_ * fVar203;
  auVar98._12_4_ = auVar28._12_4_ * fVar187;
  auVar35 = vfmadd231ps_fma(auVar50,auVar34,auVar30);
  auVar36 = vfmadd231ps_fma(auVar41,auVar34,auVar39);
  auVar34 = vfmadd231ps_fma(auVar98,auVar32,auVar34);
  auVar37 = vfmadd231ps_fma(auVar35,auVar48,auVar29);
  auVar36 = vfmadd231ps_fma(auVar36,auVar48,auVar31);
  auVar38 = vfmadd231ps_fma(auVar34,auVar33,auVar48);
  auVar49._4_4_ = auVar43._0_4_;
  auVar49._0_4_ = auVar43._0_4_;
  auVar49._8_4_ = auVar43._0_4_;
  auVar49._12_4_ = auVar43._0_4_;
  auVar34 = vshufps_avx(auVar43,auVar43,0x55);
  auVar35 = vshufps_avx(auVar43,auVar43,0xaa);
  auVar26 = vmulps_avx512vl(auVar35,auVar26);
  auVar51._0_4_ = auVar35._0_4_ * auVar27._0_4_;
  auVar51._4_4_ = auVar35._4_4_ * auVar27._4_4_;
  auVar51._8_4_ = auVar35._8_4_ * auVar27._8_4_;
  auVar51._12_4_ = auVar35._12_4_ * auVar27._12_4_;
  auVar44._0_4_ = auVar35._0_4_ * auVar28._0_4_;
  auVar44._4_4_ = auVar35._4_4_ * auVar28._4_4_;
  auVar44._8_4_ = auVar35._8_4_ * auVar28._8_4_;
  auVar44._12_4_ = auVar35._12_4_ * auVar28._12_4_;
  auVar27 = vfmadd231ps_avx512vl(auVar26,auVar34,auVar30);
  auVar30 = vfmadd231ps_fma(auVar51,auVar34,auVar39);
  auVar26 = vfmadd231ps_fma(auVar44,auVar34,auVar32);
  auVar28 = vfmadd231ps_avx512vl(auVar27,auVar49,auVar29);
  auVar27 = vfmadd231ps_fma(auVar30,auVar49,auVar31);
  auVar32 = vfmadd231ps_fma(auVar26,auVar49,auVar33);
  auVar29 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar237 = ZEXT1664(auVar29);
  auVar30 = vandps_avx512vl(auVar37,auVar29);
  auVar47._8_4_ = 0x219392ef;
  auVar47._0_8_ = 0x219392ef219392ef;
  auVar47._12_4_ = 0x219392ef;
  uVar25 = vcmpps_avx512vl(auVar30,auVar47,1);
  bVar23 = (bool)((byte)uVar25 & 1);
  auVar35._0_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * auVar37._0_4_;
  bVar23 = (bool)((byte)(uVar25 >> 1) & 1);
  auVar35._4_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * auVar37._4_4_;
  bVar23 = (bool)((byte)(uVar25 >> 2) & 1);
  auVar35._8_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * auVar37._8_4_;
  bVar23 = (bool)((byte)(uVar25 >> 3) & 1);
  auVar35._12_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * auVar37._12_4_;
  auVar30 = vandps_avx512vl(auVar36,auVar29);
  uVar25 = vcmpps_avx512vl(auVar30,auVar47,1);
  bVar23 = (bool)((byte)uVar25 & 1);
  auVar37._0_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * auVar36._0_4_;
  bVar23 = (bool)((byte)(uVar25 >> 1) & 1);
  auVar37._4_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * auVar36._4_4_;
  bVar23 = (bool)((byte)(uVar25 >> 2) & 1);
  auVar37._8_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * auVar36._8_4_;
  bVar23 = (bool)((byte)(uVar25 >> 3) & 1);
  auVar37._12_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * auVar36._12_4_;
  auVar29 = vandps_avx512vl(auVar38,auVar29);
  uVar25 = vcmpps_avx512vl(auVar29,auVar47,1);
  bVar23 = (bool)((byte)uVar25 & 1);
  auVar36._0_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * auVar38._0_4_;
  bVar23 = (bool)((byte)(uVar25 >> 1) & 1);
  auVar36._4_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * auVar38._4_4_;
  bVar23 = (bool)((byte)(uVar25 >> 2) & 1);
  auVar36._8_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * auVar38._8_4_;
  bVar23 = (bool)((byte)(uVar25 >> 3) & 1);
  auVar36._12_4_ = (uint)bVar23 * 0x219392ef | (uint)!bVar23 * auVar38._12_4_;
  auVar29 = vrcp14ps_avx512vl(auVar35);
  auVar30 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar238 = ZEXT1664(auVar30);
  auVar26 = vfnmadd213ps_avx512vl(auVar35,auVar29,auVar30);
  auVar26 = vfmadd132ps_fma(auVar26,auVar29,auVar29);
  auVar29 = vrcp14ps_avx512vl(auVar37);
  auVar31 = vfnmadd213ps_avx512vl(auVar37,auVar29,auVar30);
  auVar39 = vfmadd132ps_fma(auVar31,auVar29,auVar29);
  auVar29 = vrcp14ps_avx512vl(auVar36);
  auVar30 = vfnmadd213ps_avx512vl(auVar36,auVar29,auVar30);
  auVar33 = vfmadd132ps_fma(auVar30,auVar29,auVar29);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(prim + uVar16 * 7 + 6);
  auVar29 = vpmovsxwd_avx(auVar29);
  auVar29 = vcvtdq2ps_avx(auVar29);
  auVar31 = vsubps_avx512vl(auVar29,auVar28);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(prim + uVar16 * 9 + 6);
  auVar29 = vpmovsxwd_avx(auVar30);
  auVar46._0_4_ = auVar26._0_4_ * auVar31._0_4_;
  auVar46._4_4_ = auVar26._4_4_ * auVar31._4_4_;
  auVar46._8_4_ = auVar26._8_4_ * auVar31._8_4_;
  auVar46._12_4_ = auVar26._12_4_ * auVar31._12_4_;
  auVar29 = vcvtdq2ps_avx(auVar29);
  auVar29 = vsubps_avx512vl(auVar29,auVar28);
  auVar45._0_4_ = auVar26._0_4_ * auVar29._0_4_;
  auVar45._4_4_ = auVar26._4_4_ * auVar29._4_4_;
  auVar45._8_4_ = auVar26._8_4_ * auVar29._8_4_;
  auVar45._12_4_ = auVar26._12_4_ * auVar29._12_4_;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar30 = vpmovsxwd_avx(auVar26);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar16 * -2 + 6);
  auVar29 = vpmovsxwd_avx(auVar31);
  auVar29 = vcvtdq2ps_avx(auVar29);
  auVar29 = vsubps_avx(auVar29,auVar27);
  auVar158._0_4_ = auVar39._0_4_ * auVar29._0_4_;
  auVar158._4_4_ = auVar39._4_4_ * auVar29._4_4_;
  auVar158._8_4_ = auVar39._8_4_ * auVar29._8_4_;
  auVar158._12_4_ = auVar39._12_4_ * auVar29._12_4_;
  auVar29 = vcvtdq2ps_avx(auVar30);
  auVar29 = vsubps_avx(auVar29,auVar27);
  auVar42._0_4_ = auVar39._0_4_ * auVar29._0_4_;
  auVar42._4_4_ = auVar39._4_4_ * auVar29._4_4_;
  auVar42._8_4_ = auVar39._8_4_ * auVar29._8_4_;
  auVar42._12_4_ = auVar39._12_4_ * auVar29._12_4_;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = *(ulong *)(prim + uVar20 + uVar16 + 6);
  auVar29 = vpmovsxwd_avx(auVar39);
  auVar29 = vcvtdq2ps_avx(auVar29);
  auVar29 = vsubps_avx(auVar29,auVar32);
  auVar52._0_4_ = auVar33._0_4_ * auVar29._0_4_;
  auVar52._4_4_ = auVar33._4_4_ * auVar29._4_4_;
  auVar52._8_4_ = auVar33._8_4_ * auVar29._8_4_;
  auVar52._12_4_ = auVar33._12_4_ * auVar29._12_4_;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + uVar16 * 0x17 + 6);
  auVar29 = vpmovsxwd_avx(auVar27);
  auVar29 = vcvtdq2ps_avx(auVar29);
  auVar29 = vsubps_avx(auVar29,auVar32);
  auVar40._0_4_ = auVar33._0_4_ * auVar29._0_4_;
  auVar40._4_4_ = auVar33._4_4_ * auVar29._4_4_;
  auVar40._8_4_ = auVar33._8_4_ * auVar29._8_4_;
  auVar40._12_4_ = auVar33._12_4_ * auVar29._12_4_;
  auVar29 = vpminsd_avx(auVar46,auVar45);
  auVar30 = vpminsd_avx(auVar158,auVar42);
  auVar29 = vmaxps_avx(auVar29,auVar30);
  auVar30 = vpminsd_avx(auVar52,auVar40);
  uVar97 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar33._4_4_ = uVar97;
  auVar33._0_4_ = uVar97;
  auVar33._8_4_ = uVar97;
  auVar33._12_4_ = uVar97;
  auVar30 = vmaxps_avx512vl(auVar30,auVar33);
  auVar29 = vmaxps_avx(auVar29,auVar30);
  auVar32._8_4_ = 0x3f7ffffa;
  auVar32._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar32._12_4_ = 0x3f7ffffa;
  local_580 = vmulps_avx512vl(auVar29,auVar32);
  auVar29 = vpmaxsd_avx(auVar46,auVar45);
  auVar30 = vpmaxsd_avx(auVar158,auVar42);
  auVar29 = vminps_avx(auVar29,auVar30);
  auVar30 = vpmaxsd_avx(auVar52,auVar40);
  uVar97 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar28._4_4_ = uVar97;
  auVar28._0_4_ = uVar97;
  auVar28._8_4_ = uVar97;
  auVar28._12_4_ = uVar97;
  auVar30 = vminps_avx512vl(auVar30,auVar28);
  auVar29 = vminps_avx(auVar29,auVar30);
  auVar34._8_4_ = 0x3f800003;
  auVar34._0_8_ = 0x3f8000033f800003;
  auVar34._12_4_ = 0x3f800003;
  auVar29 = vmulps_avx512vl(auVar29,auVar34);
  auVar30 = vpbroadcastd_avx512vl();
  uVar9 = vcmpps_avx512vl(local_580,auVar29,2);
  uVar25 = vpcmpgtd_avx512vl(auVar30,_DAT_01ff0cf0);
  uVar25 = ((byte)uVar9 & 0xf) & uVar25;
  bVar23 = (char)uVar25 == '\0';
  local_771 = !bVar23;
  if (bVar23) {
    return local_771;
  }
  auVar103 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_380 = vmovdqa64_avx512f(auVar103);
  auVar29 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar103 = ZEXT1664(auVar29);
  auVar29 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar235 = ZEXT1664(auVar29);
  auVar29 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
  auVar240 = ZEXT1664(auVar29);
LAB_01b4532a:
  lVar21 = 0;
  for (uVar16 = uVar25; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000) {
    lVar21 = lVar21 + 1;
  }
  uVar22 = *(uint *)(prim + 2);
  pGVar5 = (context->scene->geometries).items[uVar22].ptr;
  lVar6 = *(long *)&pGVar5[1].time_range.upper;
  uVar16 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                           (ulong)*(uint *)(prim + lVar21 * 4 + 6) *
                           pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar29 = *(undefined1 (*) [16])(lVar6 + (long)pGVar5[1].intersectionFilterN * uVar16);
  lVar21 = uVar16 + 1;
  auVar30 = *(undefined1 (*) [16])(lVar6 + (long)pGVar5[1].intersectionFilterN * lVar21);
  _Var7 = pGVar5[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar26 = *(undefined1 (*) [16])(_Var7 + (long)pGVar5[2].userPtr * uVar16);
  auVar31 = *(undefined1 (*) [16])(_Var7 + (long)pGVar5[2].userPtr * lVar21);
  auVar75 = vpbroadcastd_avx512f();
  local_300 = vmovdqa64_avx512f(auVar75);
  auVar39 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar39 = vinsertps_avx(auVar39,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  auVar32 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
  auVar33 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (pGVar5[2].intersectionFilterN + (long)pGVar5[2].pointQueryFunc * uVar16),
                       auVar29,auVar32);
  auVar28 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (pGVar5[2].intersectionFilterN + (long)pGVar5[2].pointQueryFunc * lVar21),
                       auVar30,auVar32);
  auVar34 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        ((long)pGVar5[3].userPtr + uVar16 * *(long *)&pGVar5[3].fnumTimeSegments),
                       auVar26,auVar32);
  auVar35 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        ((long)pGVar5[3].userPtr + *(long *)&pGVar5[3].fnumTimeSegments * lVar21),
                       auVar31,auVar32);
  auVar75._0_16_ = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
  auVar27 = vmulps_avx512vl(auVar30,auVar75._0_16_);
  auVar36 = vfmadd231ps_avx512vl(auVar27,auVar28,auVar75._0_16_);
  auVar27 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar33,auVar36);
  auVar171._0_4_ = auVar27._0_4_ + auVar29._0_4_;
  auVar171._4_4_ = auVar27._4_4_ + auVar29._4_4_;
  auVar171._8_4_ = auVar27._8_4_ + auVar29._8_4_;
  auVar171._12_4_ = auVar27._12_4_ + auVar29._12_4_;
  auVar98 = auVar103._0_16_;
  auVar27 = vfmadd231ps_avx512vl(auVar36,auVar33,auVar98);
  auVar36 = vfnmadd231ps_avx512vl(auVar27,auVar29,auVar98);
  auVar27 = vmulps_avx512vl(auVar31,auVar75._0_16_);
  auVar37 = vfmadd231ps_avx512vl(auVar27,auVar35,auVar75._0_16_);
  auVar27 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar34,auVar37);
  auVar226._0_4_ = auVar27._0_4_ + auVar26._0_4_;
  auVar226._4_4_ = auVar27._4_4_ + auVar26._4_4_;
  auVar226._8_4_ = auVar27._8_4_ + auVar26._8_4_;
  auVar226._12_4_ = auVar27._12_4_ + auVar26._12_4_;
  auVar27 = vfmadd231ps_avx512vl(auVar37,auVar34,auVar98);
  auVar37 = vfnmadd231ps_avx512vl(auVar27,auVar26,auVar98);
  auVar27 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar28,auVar30);
  auVar27 = vfmadd231ps_avx512vl(auVar27,auVar33,auVar75._0_16_);
  auVar38 = vfmadd231ps_avx512vl(auVar27,auVar29,auVar75._0_16_);
  auVar30 = vmulps_avx512vl(auVar30,auVar98);
  auVar30 = vfnmadd231ps_avx512vl(auVar30,auVar98,auVar28);
  auVar30 = vfmadd231ps_avx512vl(auVar30,auVar75._0_16_,auVar33);
  auVar28 = vfnmadd231ps_avx512vl(auVar30,auVar75._0_16_,auVar29);
  auVar29 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar35,auVar31);
  auVar29 = vfmadd231ps_avx512vl(auVar29,auVar34,auVar75._0_16_);
  auVar27 = vfmadd231ps_avx512vl(auVar29,auVar26,auVar75._0_16_);
  auVar29 = vmulps_avx512vl(auVar31,auVar98);
  auVar29 = vfnmadd231ps_avx512vl(auVar29,auVar98,auVar35);
  auVar29 = vfmadd231ps_avx512vl(auVar29,auVar75._0_16_,auVar34);
  auVar33 = vfnmadd231ps_avx512vl(auVar29,auVar75._0_16_,auVar26);
  auVar29 = vshufps_avx(auVar36,auVar36,0xc9);
  auVar30 = vshufps_avx(auVar226,auVar226,0xc9);
  fVar157 = auVar36._0_4_;
  auVar136._0_4_ = fVar157 * auVar30._0_4_;
  fVar169 = auVar36._4_4_;
  auVar136._4_4_ = fVar169 * auVar30._4_4_;
  fVar201 = auVar36._8_4_;
  auVar136._8_4_ = fVar201 * auVar30._8_4_;
  fVar202 = auVar36._12_4_;
  auVar136._12_4_ = fVar202 * auVar30._12_4_;
  auVar30 = vfmsub231ps_fma(auVar136,auVar29,auVar226);
  auVar26 = vshufps_avx(auVar30,auVar30,0xc9);
  auVar30 = vshufps_avx(auVar37,auVar37,0xc9);
  auVar144._0_4_ = fVar157 * auVar30._0_4_;
  auVar144._4_4_ = fVar169 * auVar30._4_4_;
  auVar144._8_4_ = fVar201 * auVar30._8_4_;
  auVar144._12_4_ = fVar202 * auVar30._12_4_;
  auVar29 = vfmsub231ps_fma(auVar144,auVar29,auVar37);
  auVar31 = vshufps_avx(auVar29,auVar29,0xc9);
  auVar29 = vshufps_avx(auVar28,auVar28,0xc9);
  auVar30 = vshufps_avx(auVar27,auVar27,0xc9);
  fVar96 = auVar28._0_4_;
  auVar188._0_4_ = auVar30._0_4_ * fVar96;
  fVar104 = auVar28._4_4_;
  auVar188._4_4_ = auVar30._4_4_ * fVar104;
  fVar203 = auVar28._8_4_;
  auVar188._8_4_ = auVar30._8_4_ * fVar203;
  fVar187 = auVar28._12_4_;
  auVar188._12_4_ = auVar30._12_4_ * fVar187;
  auVar30 = vfmsub231ps_fma(auVar188,auVar29,auVar27);
  auVar27 = vshufps_avx(auVar30,auVar30,0xc9);
  auVar30 = vshufps_avx(auVar33,auVar33,0xc9);
  auVar189._0_4_ = auVar30._0_4_ * fVar96;
  auVar189._4_4_ = auVar30._4_4_ * fVar104;
  auVar189._8_4_ = auVar30._8_4_ * fVar203;
  auVar189._12_4_ = auVar30._12_4_ * fVar187;
  auVar29 = vfmsub231ps_fma(auVar189,auVar29,auVar33);
  auVar33 = vshufps_avx(auVar29,auVar29,0xc9);
  auVar29 = vdpps_avx(auVar26,auVar26,0x7f);
  fVar199 = auVar29._0_4_;
  auVar103._4_60_ = auVar75._4_60_;
  auVar103._0_4_ = fVar199;
  auVar30 = vrsqrt14ss_avx512f(auVar75._0_16_,auVar103._0_16_);
  fVar200 = auVar30._0_4_;
  auVar30 = vmulss_avx512f(auVar29,ZEXT416(0x3f000000));
  fVar180 = fVar200 * 1.5 - auVar30._0_4_ * fVar200 * fVar200 * fVar200;
  fVar215 = fVar180 * auVar26._0_4_;
  fVar223 = fVar180 * auVar26._4_4_;
  fVar224 = fVar180 * auVar26._8_4_;
  fVar225 = fVar180 * auVar26._12_4_;
  auVar30 = vdpps_avx(auVar26,auVar31,0x7f);
  auVar145._0_4_ = fVar199 * auVar31._0_4_;
  auVar145._4_4_ = fVar199 * auVar31._4_4_;
  auVar145._8_4_ = fVar199 * auVar31._8_4_;
  auVar145._12_4_ = fVar199 * auVar31._12_4_;
  fVar199 = auVar30._0_4_;
  auVar137._0_4_ = fVar199 * auVar26._0_4_;
  auVar137._4_4_ = fVar199 * auVar26._4_4_;
  auVar137._8_4_ = fVar199 * auVar26._8_4_;
  auVar137._12_4_ = fVar199 * auVar26._12_4_;
  auVar26 = vsubps_avx(auVar145,auVar137);
  auVar30 = vrcp14ss_avx512f(auVar75._0_16_,auVar103._0_16_);
  auVar29 = vfnmadd213ss_avx512f(auVar29,auVar30,ZEXT416(0x40000000));
  fVar199 = auVar30._0_4_ * auVar29._0_4_;
  auVar29 = vdpps_avx(auVar27,auVar27,0x7f);
  fVar200 = auVar29._0_4_;
  auVar236._16_48_ = auVar75._16_48_;
  auVar236._0_16_ = auVar75._0_16_;
  auVar92._4_60_ = auVar236._4_60_;
  auVar92._0_4_ = fVar200;
  auVar30 = vrsqrt14ss_avx512f(auVar75._0_16_,auVar92._0_16_);
  fVar186 = auVar30._0_4_;
  auVar30 = vmulss_avx512f(auVar29,ZEXT416(0x3f000000));
  fVar186 = fVar186 * 1.5 - auVar30._0_4_ * fVar186 * fVar186 * fVar186;
  fVar204 = fVar186 * auVar27._0_4_;
  fVar212 = fVar186 * auVar27._4_4_;
  fVar213 = fVar186 * auVar27._8_4_;
  fVar214 = fVar186 * auVar27._12_4_;
  auVar30 = vdpps_avx(auVar27,auVar33,0x7f);
  auVar115._0_4_ = fVar200 * auVar33._0_4_;
  auVar115._4_4_ = fVar200 * auVar33._4_4_;
  auVar115._8_4_ = fVar200 * auVar33._8_4_;
  auVar115._12_4_ = fVar200 * auVar33._12_4_;
  fVar200 = auVar30._0_4_;
  auVar53._0_4_ = fVar200 * auVar27._0_4_;
  auVar53._4_4_ = fVar200 * auVar27._4_4_;
  auVar53._8_4_ = fVar200 * auVar27._8_4_;
  auVar53._12_4_ = fVar200 * auVar27._12_4_;
  auVar31 = vsubps_avx(auVar115,auVar53);
  auVar30 = vrcp14ss_avx512f(auVar75._0_16_,auVar92._0_16_);
  auVar29 = vfnmadd213ss_avx512f(auVar29,auVar30,ZEXT416(0x40000000));
  fVar200 = auVar30._0_4_ * auVar29._0_4_;
  auVar29 = vshufps_avx(auVar171,auVar171,0xff);
  auVar138._0_4_ = fVar215 * auVar29._0_4_;
  auVar138._4_4_ = fVar223 * auVar29._4_4_;
  auVar138._8_4_ = fVar224 * auVar29._8_4_;
  auVar138._12_4_ = fVar225 * auVar29._12_4_;
  local_500 = vsubps_avx(auVar171,auVar138);
  auVar30 = vshufps_avx(auVar36,auVar36,0xff);
  auVar116._0_4_ = fVar215 * auVar30._0_4_ + auVar29._0_4_ * fVar180 * auVar26._0_4_ * fVar199;
  auVar116._4_4_ = fVar223 * auVar30._4_4_ + auVar29._4_4_ * fVar180 * auVar26._4_4_ * fVar199;
  auVar116._8_4_ = fVar224 * auVar30._8_4_ + auVar29._8_4_ * fVar180 * auVar26._8_4_ * fVar199;
  auVar116._12_4_ = fVar225 * auVar30._12_4_ + auVar29._12_4_ * fVar180 * auVar26._12_4_ * fVar199;
  auVar26 = vsubps_avx(auVar36,auVar116);
  local_510._0_4_ = auVar171._0_4_ + auVar138._0_4_;
  local_510._4_4_ = auVar171._4_4_ + auVar138._4_4_;
  fStack_508 = auVar171._8_4_ + auVar138._8_4_;
  fStack_504 = auVar171._12_4_ + auVar138._12_4_;
  auVar117._0_4_ = fVar157 + auVar116._0_4_;
  auVar117._4_4_ = fVar169 + auVar116._4_4_;
  auVar117._8_4_ = fVar201 + auVar116._8_4_;
  auVar117._12_4_ = fVar202 + auVar116._12_4_;
  auVar29 = vshufps_avx(auVar38,auVar38,0xff);
  auVar146._0_4_ = fVar204 * auVar29._0_4_;
  auVar146._4_4_ = fVar212 * auVar29._4_4_;
  auVar146._8_4_ = fVar213 * auVar29._8_4_;
  auVar146._12_4_ = fVar214 * auVar29._12_4_;
  local_520 = vsubps_avx(auVar38,auVar146);
  auVar30 = vshufps_avx(auVar28,auVar28,0xff);
  auVar99._0_4_ = fVar204 * auVar30._0_4_ + auVar29._0_4_ * fVar186 * auVar31._0_4_ * fVar200;
  auVar99._4_4_ = fVar212 * auVar30._4_4_ + auVar29._4_4_ * fVar186 * auVar31._4_4_ * fVar200;
  auVar99._8_4_ = fVar213 * auVar30._8_4_ + auVar29._8_4_ * fVar186 * auVar31._8_4_ * fVar200;
  auVar99._12_4_ = fVar214 * auVar30._12_4_ + auVar29._12_4_ * fVar186 * auVar31._12_4_ * fVar200;
  auVar29 = vsubps_avx(auVar28,auVar99);
  _local_530 = vaddps_avx512vl(auVar38,auVar146);
  auVar100._0_4_ = fVar96 + auVar99._0_4_;
  auVar100._4_4_ = fVar104 + auVar99._4_4_;
  auVar100._8_4_ = fVar203 + auVar99._8_4_;
  auVar100._12_4_ = fVar187 + auVar99._12_4_;
  auVar30 = vmulps_avx512vl(auVar26,auVar32);
  local_540 = vaddps_avx512vl(local_500,auVar30);
  auVar29 = vmulps_avx512vl(auVar29,auVar32);
  local_550 = vsubps_avx512vl(local_520,auVar29);
  auVar29 = vmulps_avx512vl(auVar117,auVar32);
  _local_560 = vaddps_avx512vl(_local_510,auVar29);
  auVar29 = vmulps_avx512vl(auVar100,auVar32);
  _local_570 = vsubps_avx512vl(_local_530,auVar29);
  local_480 = vsubps_avx(local_500,auVar39);
  uVar97 = local_480._0_4_;
  auVar105._4_4_ = uVar97;
  auVar105._0_4_ = uVar97;
  auVar105._8_4_ = uVar97;
  auVar105._12_4_ = uVar97;
  auVar29 = vshufps_avx(local_480,local_480,0x55);
  auVar30 = vshufps_avx(local_480,local_480,0xaa);
  aVar1 = pre->ray_space[k].vx.field_0;
  aVar2 = pre->ray_space[k].vy.field_0;
  fVar96 = pre->ray_space[k].vz.field_0.m128[0];
  fVar104 = pre->ray_space[k].vz.field_0.m128[1];
  fVar203 = pre->ray_space[k].vz.field_0.m128[2];
  fVar187 = pre->ray_space[k].vz.field_0.m128[3];
  auVar101._0_4_ = fVar96 * auVar30._0_4_;
  auVar101._4_4_ = fVar104 * auVar30._4_4_;
  auVar101._8_4_ = fVar203 * auVar30._8_4_;
  auVar101._12_4_ = fVar187 * auVar30._12_4_;
  auVar29 = vfmadd231ps_fma(auVar101,(undefined1  [16])aVar2,auVar29);
  auVar32 = vfmadd231ps_fma(auVar29,(undefined1  [16])aVar1,auVar105);
  local_490 = vsubps_avx512vl(local_540,auVar39);
  uVar97 = local_490._0_4_;
  auVar118._4_4_ = uVar97;
  auVar118._0_4_ = uVar97;
  auVar118._8_4_ = uVar97;
  auVar118._12_4_ = uVar97;
  auVar29 = vshufps_avx(local_490,local_490,0x55);
  auVar30 = vshufps_avx(local_490,local_490,0xaa);
  auVar106._0_4_ = fVar96 * auVar30._0_4_;
  auVar106._4_4_ = fVar104 * auVar30._4_4_;
  auVar106._8_4_ = fVar203 * auVar30._8_4_;
  auVar106._12_4_ = fVar187 * auVar30._12_4_;
  auVar29 = vfmadd231ps_fma(auVar106,(undefined1  [16])aVar2,auVar29);
  auVar28 = vfmadd231ps_fma(auVar29,(undefined1  [16])aVar1,auVar118);
  local_4a0 = vsubps_avx512vl(local_550,auVar39);
  uVar97 = local_4a0._0_4_;
  auVar119._4_4_ = uVar97;
  auVar119._0_4_ = uVar97;
  auVar119._8_4_ = uVar97;
  auVar119._12_4_ = uVar97;
  auVar29 = vshufps_avx(local_4a0,local_4a0,0x55);
  auVar30 = vshufps_avx(local_4a0,local_4a0,0xaa);
  auVar172._0_4_ = auVar30._0_4_ * fVar96;
  auVar172._4_4_ = auVar30._4_4_ * fVar104;
  auVar172._8_4_ = auVar30._8_4_ * fVar203;
  auVar172._12_4_ = auVar30._12_4_ * fVar187;
  auVar29 = vfmadd231ps_fma(auVar172,(undefined1  [16])aVar2,auVar29);
  auVar34 = vfmadd231ps_fma(auVar29,(undefined1  [16])aVar1,auVar119);
  local_4b0 = vsubps_avx(local_520,auVar39);
  uVar97 = local_4b0._0_4_;
  auVar120._4_4_ = uVar97;
  auVar120._0_4_ = uVar97;
  auVar120._8_4_ = uVar97;
  auVar120._12_4_ = uVar97;
  auVar29 = vshufps_avx(local_4b0,local_4b0,0x55);
  auVar30 = vshufps_avx(local_4b0,local_4b0,0xaa);
  auVar181._0_4_ = auVar30._0_4_ * fVar96;
  auVar181._4_4_ = auVar30._4_4_ * fVar104;
  auVar181._8_4_ = auVar30._8_4_ * fVar203;
  auVar181._12_4_ = auVar30._12_4_ * fVar187;
  auVar29 = vfmadd231ps_fma(auVar181,(undefined1  [16])aVar2,auVar29);
  auVar35 = vfmadd231ps_fma(auVar29,(undefined1  [16])aVar1,auVar120);
  local_4c0 = vsubps_avx(_local_510,auVar39);
  uVar97 = local_4c0._0_4_;
  auVar121._4_4_ = uVar97;
  auVar121._0_4_ = uVar97;
  auVar121._8_4_ = uVar97;
  auVar121._12_4_ = uVar97;
  auVar29 = vshufps_avx(local_4c0,local_4c0,0x55);
  auVar30 = vshufps_avx(local_4c0,local_4c0,0xaa);
  auVar190._0_4_ = auVar30._0_4_ * fVar96;
  auVar190._4_4_ = auVar30._4_4_ * fVar104;
  auVar190._8_4_ = auVar30._8_4_ * fVar203;
  auVar190._12_4_ = auVar30._12_4_ * fVar187;
  auVar29 = vfmadd231ps_fma(auVar190,(undefined1  [16])aVar2,auVar29);
  auVar36 = vfmadd231ps_fma(auVar29,(undefined1  [16])aVar1,auVar121);
  local_4d0 = vsubps_avx512vl(_local_560,auVar39);
  uVar97 = local_4d0._0_4_;
  auVar122._4_4_ = uVar97;
  auVar122._0_4_ = uVar97;
  auVar122._8_4_ = uVar97;
  auVar122._12_4_ = uVar97;
  auVar29 = vshufps_avx(local_4d0,local_4d0,0x55);
  auVar30 = vshufps_avx(local_4d0,local_4d0,0xaa);
  auVar205._0_4_ = auVar30._0_4_ * fVar96;
  auVar205._4_4_ = auVar30._4_4_ * fVar104;
  auVar205._8_4_ = auVar30._8_4_ * fVar203;
  auVar205._12_4_ = auVar30._12_4_ * fVar187;
  auVar29 = vfmadd231ps_fma(auVar205,(undefined1  [16])aVar2,auVar29);
  auVar37 = vfmadd231ps_fma(auVar29,(undefined1  [16])aVar1,auVar122);
  local_4e0 = vsubps_avx512vl(_local_570,auVar39);
  uVar97 = local_4e0._0_4_;
  auVar123._4_4_ = uVar97;
  auVar123._0_4_ = uVar97;
  auVar123._8_4_ = uVar97;
  auVar123._12_4_ = uVar97;
  auVar29 = vshufps_avx(local_4e0,local_4e0,0x55);
  auVar30 = vshufps_avx(local_4e0,local_4e0,0xaa);
  auVar216._0_4_ = auVar30._0_4_ * fVar96;
  auVar216._4_4_ = auVar30._4_4_ * fVar104;
  auVar216._8_4_ = auVar30._8_4_ * fVar203;
  auVar216._12_4_ = auVar30._12_4_ * fVar187;
  auVar29 = vfmadd231ps_fma(auVar216,(undefined1  [16])aVar2,auVar29);
  auVar38 = vfmadd231ps_fma(auVar29,(undefined1  [16])aVar1,auVar123);
  local_4f0 = vsubps_avx512vl(_local_530,auVar39);
  uVar97 = local_4f0._0_4_;
  auVar124._4_4_ = uVar97;
  auVar124._0_4_ = uVar97;
  auVar124._8_4_ = uVar97;
  auVar124._12_4_ = uVar97;
  auVar29 = vshufps_avx(local_4f0,local_4f0,0x55);
  auVar30 = vshufps_avx(local_4f0,local_4f0,0xaa);
  auVar147._0_4_ = fVar96 * auVar30._0_4_;
  auVar147._4_4_ = fVar104 * auVar30._4_4_;
  auVar147._8_4_ = fVar203 * auVar30._8_4_;
  auVar147._12_4_ = fVar187 * auVar30._12_4_;
  auVar29 = vfmadd231ps_fma(auVar147,(undefined1  [16])aVar2,auVar29);
  auVar98 = vfmadd231ps_fma(auVar29,(undefined1  [16])aVar1,auVar124);
  auVar26 = vmovlhps_avx(auVar32,auVar36);
  auVar31 = vmovlhps_avx(auVar28,auVar37);
  auVar27 = vmovlhps_avx512f(auVar34,auVar38);
  auVar33 = vmovlhps_avx512f(auVar35,auVar98);
  auVar30 = vminps_avx(auVar26,auVar31);
  auVar29 = vmaxps_avx(auVar26,auVar31);
  auVar39 = vminps_avx512vl(auVar27,auVar33);
  auVar30 = vminps_avx(auVar30,auVar39);
  auVar39 = vmaxps_avx512vl(auVar27,auVar33);
  auVar29 = vmaxps_avx(auVar29,auVar39);
  auVar39 = vshufpd_avx(auVar30,auVar30,3);
  auVar30 = vminps_avx(auVar30,auVar39);
  auVar39 = vshufpd_avx(auVar29,auVar29,3);
  auVar29 = vmaxps_avx(auVar29,auVar39);
  auVar30 = vandps_avx512vl(auVar30,auVar237._0_16_);
  auVar29 = vandps_avx512vl(auVar29,auVar237._0_16_);
  auVar29 = vmaxps_avx(auVar30,auVar29);
  auVar30 = vmovshdup_avx(auVar29);
  auVar29 = vmaxss_avx(auVar30,auVar29);
  fVar104 = auVar29._0_4_ * 9.536743e-07;
  auVar39 = vmovddup_avx512vl(auVar32);
  auVar32 = vmovddup_avx512vl(auVar28);
  auVar107._8_8_ = auVar34._0_8_;
  auVar107._0_8_ = auVar34._0_8_;
  auVar173._8_8_ = auVar35._0_8_;
  auVar173._0_8_ = auVar35._0_8_;
  local_3c0 = vbroadcastss_avx512vl(ZEXT416((uint)fVar104));
  auVar29 = vxorps_avx512vl(local_3c0._0_16_,auVar235._0_16_);
  local_3e0 = vbroadcastss_avx512vl(auVar29);
  bVar23 = false;
  uVar16 = 0;
  fVar96 = *(float *)(ray + k * 4 + 0xc0);
  auVar29 = vsubps_avx(auVar31,auVar26);
  auVar77._0_16_ = vsubps_avx512vl(auVar27,auVar31);
  local_470 = vsubps_avx512vl(auVar33,auVar27);
  local_590 = vsubps_avx(_local_510,local_500);
  local_5a0 = vsubps_avx512vl(_local_560,local_540);
  local_5b0 = vsubps_avx512vl(_local_570,local_550);
  _local_5c0 = vsubps_avx512vl(_local_530,local_520);
  auVar103 = vpbroadcastd_avx512f();
  local_340 = vmovdqa64_avx512f(auVar103);
  auVar30 = ZEXT816(0x3f80000000000000);
  auVar75 = ZEXT1664(auVar30);
  auVar78._32_32_ = auVar103._32_32_;
  do {
    auVar43 = auVar75._0_16_;
    auVar28 = vshufps_avx(auVar43,auVar43,0x50);
    auVar227._8_4_ = 0x3f800000;
    auVar227._0_8_ = &DAT_3f8000003f800000;
    auVar227._12_4_ = 0x3f800000;
    auVar74._16_4_ = 0x3f800000;
    auVar74._0_16_ = auVar227;
    auVar74._20_4_ = 0x3f800000;
    auVar74._24_4_ = 0x3f800000;
    auVar74._28_4_ = 0x3f800000;
    auVar34 = vsubps_avx(auVar227,auVar28);
    fVar203 = auVar28._0_4_;
    fVar180 = auVar36._0_4_;
    auVar129._0_4_ = fVar180 * fVar203;
    fVar187 = auVar28._4_4_;
    fVar186 = auVar36._4_4_;
    auVar129._4_4_ = fVar186 * fVar187;
    fVar199 = auVar28._8_4_;
    auVar129._8_4_ = fVar180 * fVar199;
    fVar200 = auVar28._12_4_;
    auVar129._12_4_ = fVar186 * fVar200;
    fVar157 = auVar37._0_4_;
    auVar139._0_4_ = fVar157 * fVar203;
    fVar169 = auVar37._4_4_;
    auVar139._4_4_ = fVar169 * fVar187;
    auVar139._8_4_ = fVar157 * fVar199;
    auVar139._12_4_ = fVar169 * fVar200;
    fVar212 = auVar38._0_4_;
    auVar148._0_4_ = fVar212 * fVar203;
    fVar213 = auVar38._4_4_;
    auVar148._4_4_ = fVar213 * fVar187;
    auVar148._8_4_ = fVar212 * fVar199;
    auVar148._12_4_ = fVar213 * fVar200;
    fVar214 = auVar98._0_4_;
    auVar108._0_4_ = fVar214 * fVar203;
    fVar215 = auVar98._4_4_;
    auVar108._4_4_ = fVar215 * fVar187;
    auVar108._8_4_ = fVar214 * fVar199;
    auVar108._12_4_ = fVar215 * fVar200;
    auVar35 = vfmadd231ps_avx512vl(auVar129,auVar34,auVar39);
    auVar40 = vfmadd231ps_avx512vl(auVar139,auVar34,auVar32);
    auVar41 = vfmadd231ps_avx512vl(auVar148,auVar34,auVar107);
    auVar34 = vfmadd231ps_fma(auVar108,auVar173,auVar34);
    auVar28 = vmovshdup_avx(auVar30);
    fVar187 = auVar30._0_4_;
    fVar203 = (auVar28._0_4_ - fVar187) * 0.04761905;
    auVar67._4_4_ = fVar187;
    auVar67._0_4_ = fVar187;
    auVar67._8_4_ = fVar187;
    auVar67._12_4_ = fVar187;
    auVar67._16_4_ = fVar187;
    auVar67._20_4_ = fVar187;
    auVar67._24_4_ = fVar187;
    auVar67._28_4_ = fVar187;
    auVar70._0_8_ = auVar28._0_8_;
    auVar70._8_8_ = auVar70._0_8_;
    auVar70._16_8_ = auVar70._0_8_;
    auVar70._24_8_ = auVar70._0_8_;
    auVar71 = vsubps_avx(auVar70,auVar67);
    uVar97 = auVar35._0_4_;
    auVar72._4_4_ = uVar97;
    auVar72._0_4_ = uVar97;
    auVar72._8_4_ = uVar97;
    auVar72._12_4_ = uVar97;
    auVar72._16_4_ = uVar97;
    auVar72._20_4_ = uVar97;
    auVar72._24_4_ = uVar97;
    auVar72._28_4_ = uVar97;
    auVar60._8_4_ = 1;
    auVar60._0_8_ = 0x100000001;
    auVar60._12_4_ = 1;
    auVar60._16_4_ = 1;
    auVar60._20_4_ = 1;
    auVar60._24_4_ = 1;
    auVar60._28_4_ = 1;
    auVar69 = ZEXT1632(auVar35);
    auVar68 = vpermps_avx2(auVar60,auVar69);
    auVar54 = vbroadcastss_avx512vl(auVar40);
    auVar70 = ZEXT1632(auVar40);
    auVar55 = vpermps_avx512vl(auVar60,auVar70);
    auVar56 = vbroadcastss_avx512vl(auVar41);
    auVar64 = ZEXT1632(auVar41);
    auVar57 = vpermps_avx512vl(auVar60,auVar64);
    auVar58 = vbroadcastss_avx512vl(auVar34);
    auVar66 = ZEXT1632(auVar34);
    auVar59 = vpermps_avx512vl(auVar60,auVar66);
    auVar73._4_4_ = fVar203;
    auVar73._0_4_ = fVar203;
    auVar73._8_4_ = fVar203;
    auVar73._12_4_ = fVar203;
    auVar73._16_4_ = fVar203;
    auVar73._20_4_ = fVar203;
    auVar73._24_4_ = fVar203;
    auVar73._28_4_ = fVar203;
    auVar65._8_4_ = 2;
    auVar65._0_8_ = 0x200000002;
    auVar65._12_4_ = 2;
    auVar65._16_4_ = 2;
    auVar65._20_4_ = 2;
    auVar65._24_4_ = 2;
    auVar65._28_4_ = 2;
    auVar60 = vpermps_avx512vl(auVar65,auVar69);
    auVar61 = vbroadcastss_avx512vl(ZEXT416(3));
    auVar62 = vpermps_avx512vl(auVar61,auVar69);
    auVar69 = vpermps_avx2(auVar65,auVar70);
    auVar63 = vpermps_avx512vl(auVar61,auVar70);
    auVar70 = vpermps_avx2(auVar65,auVar64);
    auVar64 = vpermps_avx512vl(auVar61,auVar64);
    auVar65 = vpermps_avx512vl(auVar65,auVar66);
    auVar61 = vpermps_avx512vl(auVar61,auVar66);
    auVar28 = vfmadd132ps_fma(auVar71,auVar67,_DAT_02020f20);
    auVar71 = vsubps_avx(auVar74,ZEXT1632(auVar28));
    auVar66 = vmulps_avx512vl(auVar54,ZEXT1632(auVar28));
    auVar74 = ZEXT1632(auVar28);
    auVar67 = vmulps_avx512vl(auVar55,auVar74);
    auVar34 = vfmadd231ps_fma(auVar66,auVar71,auVar72);
    auVar35 = vfmadd231ps_fma(auVar67,auVar71,auVar68);
    auVar66 = vmulps_avx512vl(auVar56,auVar74);
    auVar67 = vmulps_avx512vl(auVar57,auVar74);
    auVar66 = vfmadd231ps_avx512vl(auVar66,auVar71,auVar54);
    auVar67 = vfmadd231ps_avx512vl(auVar67,auVar71,auVar55);
    auVar54 = vmulps_avx512vl(auVar58,auVar74);
    auVar72 = ZEXT1632(auVar28);
    auVar55 = vmulps_avx512vl(auVar59,auVar72);
    auVar56 = vfmadd231ps_avx512vl(auVar54,auVar71,auVar56);
    auVar57 = vfmadd231ps_avx512vl(auVar55,auVar71,auVar57);
    fVar199 = auVar28._0_4_;
    fVar200 = auVar28._4_4_;
    auVar54._4_4_ = fVar200 * auVar66._4_4_;
    auVar54._0_4_ = fVar199 * auVar66._0_4_;
    fVar201 = auVar28._8_4_;
    auVar54._8_4_ = fVar201 * auVar66._8_4_;
    fVar202 = auVar28._12_4_;
    auVar54._12_4_ = fVar202 * auVar66._12_4_;
    auVar54._16_4_ = auVar66._16_4_ * 0.0;
    auVar54._20_4_ = auVar66._20_4_ * 0.0;
    auVar54._24_4_ = auVar66._24_4_ * 0.0;
    auVar54._28_4_ = fVar187;
    auVar55._4_4_ = fVar200 * auVar67._4_4_;
    auVar55._0_4_ = fVar199 * auVar67._0_4_;
    auVar55._8_4_ = fVar201 * auVar67._8_4_;
    auVar55._12_4_ = fVar202 * auVar67._12_4_;
    auVar55._16_4_ = auVar67._16_4_ * 0.0;
    auVar55._20_4_ = auVar67._20_4_ * 0.0;
    auVar55._24_4_ = auVar67._24_4_ * 0.0;
    auVar55._28_4_ = auVar68._28_4_;
    auVar34 = vfmadd231ps_fma(auVar54,auVar71,ZEXT1632(auVar34));
    auVar35 = vfmadd231ps_fma(auVar55,auVar71,ZEXT1632(auVar35));
    auVar59._0_4_ = fVar199 * auVar56._0_4_;
    auVar59._4_4_ = fVar200 * auVar56._4_4_;
    auVar59._8_4_ = fVar201 * auVar56._8_4_;
    auVar59._12_4_ = fVar202 * auVar56._12_4_;
    auVar59._16_4_ = auVar56._16_4_ * 0.0;
    auVar59._20_4_ = auVar56._20_4_ * 0.0;
    auVar59._24_4_ = auVar56._24_4_ * 0.0;
    auVar59._28_4_ = 0;
    auVar68._4_4_ = fVar200 * auVar57._4_4_;
    auVar68._0_4_ = fVar199 * auVar57._0_4_;
    auVar68._8_4_ = fVar201 * auVar57._8_4_;
    auVar68._12_4_ = fVar202 * auVar57._12_4_;
    auVar68._16_4_ = auVar57._16_4_ * 0.0;
    auVar68._20_4_ = auVar57._20_4_ * 0.0;
    auVar68._24_4_ = auVar57._24_4_ * 0.0;
    auVar68._28_4_ = auVar56._28_4_;
    auVar40 = vfmadd231ps_fma(auVar59,auVar71,auVar66);
    auVar41 = vfmadd231ps_fma(auVar68,auVar71,auVar67);
    auVar56._28_4_ = auVar67._28_4_;
    auVar56._0_28_ =
         ZEXT1628(CONCAT412(fVar202 * auVar41._12_4_,
                            CONCAT48(fVar201 * auVar41._8_4_,
                                     CONCAT44(fVar200 * auVar41._4_4_,fVar199 * auVar41._0_4_))));
    auVar42 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar202 * auVar40._12_4_,
                                                 CONCAT48(fVar201 * auVar40._8_4_,
                                                          CONCAT44(fVar200 * auVar40._4_4_,
                                                                   fVar199 * auVar40._0_4_)))),
                              auVar71,ZEXT1632(auVar34));
    auVar44 = vfmadd231ps_fma(auVar56,auVar71,ZEXT1632(auVar35));
    auVar68 = vsubps_avx(ZEXT1632(auVar40),ZEXT1632(auVar34));
    auVar54 = vsubps_avx(ZEXT1632(auVar41),ZEXT1632(auVar35));
    auVar55 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar68 = vmulps_avx512vl(auVar68,auVar55);
    auVar54 = vmulps_avx512vl(auVar54,auVar55);
    auVar66._0_4_ = fVar203 * auVar68._0_4_;
    auVar66._4_4_ = fVar203 * auVar68._4_4_;
    auVar66._8_4_ = fVar203 * auVar68._8_4_;
    auVar66._12_4_ = fVar203 * auVar68._12_4_;
    auVar66._16_4_ = fVar203 * auVar68._16_4_;
    auVar66._20_4_ = fVar203 * auVar68._20_4_;
    auVar66._24_4_ = fVar203 * auVar68._24_4_;
    auVar66._28_4_ = 0;
    auVar68 = vmulps_avx512vl(auVar73,auVar54);
    auVar40 = vxorps_avx512vl(auVar58._0_16_,auVar58._0_16_);
    auVar54 = vpermt2ps_avx512vl(ZEXT1632(auVar42),_DAT_0205fd20,ZEXT1632(auVar40));
    auVar56 = vpermt2ps_avx512vl(ZEXT1632(auVar44),_DAT_0205fd20,ZEXT1632(auVar40));
    auVar114._0_4_ = auVar66._0_4_ + auVar42._0_4_;
    auVar114._4_4_ = auVar66._4_4_ + auVar42._4_4_;
    auVar114._8_4_ = auVar66._8_4_ + auVar42._8_4_;
    auVar114._12_4_ = auVar66._12_4_ + auVar42._12_4_;
    auVar114._16_4_ = auVar66._16_4_ + 0.0;
    auVar114._20_4_ = auVar66._20_4_ + 0.0;
    auVar114._24_4_ = auVar66._24_4_ + 0.0;
    auVar114._28_4_ = 0;
    auVar67 = ZEXT1632(auVar40);
    auVar57 = vpermt2ps_avx512vl(auVar66,_DAT_0205fd20,auVar67);
    auVar58 = vaddps_avx512vl(ZEXT1632(auVar44),auVar68);
    auVar59 = vpermt2ps_avx512vl(auVar68,_DAT_0205fd20,auVar67);
    auVar68 = vsubps_avx(auVar54,auVar57);
    auVar59 = vsubps_avx512vl(auVar56,auVar59);
    auVar57 = vmulps_avx512vl(auVar69,auVar72);
    auVar66 = vmulps_avx512vl(auVar63,auVar72);
    auVar57 = vfmadd231ps_avx512vl(auVar57,auVar71,auVar60);
    auVar60 = vfmadd231ps_avx512vl(auVar66,auVar71,auVar62);
    auVar62 = vmulps_avx512vl(auVar70,auVar72);
    auVar66 = vmulps_avx512vl(auVar64,auVar72);
    auVar69 = vfmadd231ps_avx512vl(auVar62,auVar71,auVar69);
    auVar62 = vfmadd231ps_avx512vl(auVar66,auVar71,auVar63);
    auVar63 = vmulps_avx512vl(auVar65,auVar72);
    auVar61 = vmulps_avx512vl(auVar61,auVar72);
    auVar34 = vfmadd231ps_fma(auVar63,auVar71,auVar70);
    auVar35 = vfmadd231ps_fma(auVar61,auVar71,auVar64);
    auVar61 = vmulps_avx512vl(auVar72,auVar69);
    auVar63 = vmulps_avx512vl(ZEXT1632(auVar28),auVar62);
    auVar61 = vfmadd231ps_avx512vl(auVar61,auVar71,auVar57);
    auVar60 = vfmadd231ps_avx512vl(auVar63,auVar71,auVar60);
    auVar63 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar202 * auVar34._12_4_,
                                            CONCAT48(fVar201 * auVar34._8_4_,
                                                     CONCAT44(fVar200 * auVar34._4_4_,
                                                              fVar199 * auVar34._0_4_)))),auVar71,
                         auVar69);
    auVar62 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar202 * auVar35._12_4_,
                                            CONCAT48(fVar201 * auVar35._8_4_,
                                                     CONCAT44(fVar200 * auVar35._4_4_,
                                                              fVar199 * auVar35._0_4_)))),auVar71,
                         auVar62);
    auVar69._4_4_ = fVar200 * auVar63._4_4_;
    auVar69._0_4_ = fVar199 * auVar63._0_4_;
    auVar69._8_4_ = fVar201 * auVar63._8_4_;
    auVar69._12_4_ = fVar202 * auVar63._12_4_;
    auVar69._16_4_ = auVar63._16_4_ * 0.0;
    auVar69._20_4_ = auVar63._20_4_ * 0.0;
    auVar69._24_4_ = auVar63._24_4_ * 0.0;
    auVar69._28_4_ = auVar64._28_4_;
    auVar57._4_4_ = fVar200 * auVar62._4_4_;
    auVar57._0_4_ = fVar199 * auVar62._0_4_;
    auVar57._8_4_ = fVar201 * auVar62._8_4_;
    auVar57._12_4_ = fVar202 * auVar62._12_4_;
    auVar57._16_4_ = auVar62._16_4_ * 0.0;
    auVar57._20_4_ = auVar62._20_4_ * 0.0;
    auVar57._24_4_ = auVar62._24_4_ * 0.0;
    auVar57._28_4_ = auVar70._28_4_;
    auVar69 = vfmadd231ps_avx512vl(auVar69,auVar71,auVar61);
    auVar70 = vfmadd231ps_avx512vl(auVar57,auVar60,auVar71);
    auVar71 = vsubps_avx512vl(auVar63,auVar61);
    auVar57 = vsubps_avx512vl(auVar62,auVar60);
    auVar60 = vmulps_avx512vl(auVar71,auVar55);
    auVar55 = vmulps_avx512vl(auVar57,auVar55);
    fVar187 = fVar203 * auVar60._0_4_;
    fVar199 = fVar203 * auVar60._4_4_;
    auVar71._4_4_ = fVar199;
    auVar71._0_4_ = fVar187;
    fVar200 = fVar203 * auVar60._8_4_;
    auVar71._8_4_ = fVar200;
    fVar201 = fVar203 * auVar60._12_4_;
    auVar71._12_4_ = fVar201;
    fVar202 = fVar203 * auVar60._16_4_;
    auVar71._16_4_ = fVar202;
    fVar204 = fVar203 * auVar60._20_4_;
    auVar71._20_4_ = fVar204;
    fVar203 = fVar203 * auVar60._24_4_;
    auVar71._24_4_ = fVar203;
    auVar71._28_4_ = auVar60._28_4_;
    auVar55 = vmulps_avx512vl(auVar73,auVar55);
    auVar57 = vpermt2ps_avx512vl(auVar69,_DAT_0205fd20,auVar67);
    auVar61 = vpermt2ps_avx512vl(auVar70,_DAT_0205fd20,auVar67);
    auVar185._0_4_ = auVar69._0_4_ + fVar187;
    auVar185._4_4_ = auVar69._4_4_ + fVar199;
    auVar185._8_4_ = auVar69._8_4_ + fVar200;
    auVar185._12_4_ = auVar69._12_4_ + fVar201;
    auVar185._16_4_ = auVar69._16_4_ + fVar202;
    auVar185._20_4_ = auVar69._20_4_ + fVar204;
    auVar185._24_4_ = auVar69._24_4_ + fVar203;
    auVar185._28_4_ = auVar69._28_4_ + auVar60._28_4_;
    auVar71 = vpermt2ps_avx512vl(auVar71,_DAT_0205fd20,ZEXT1632(auVar40));
    auVar60 = vaddps_avx512vl(auVar70,auVar55);
    auVar55 = vpermt2ps_avx512vl(auVar55,_DAT_0205fd20,ZEXT1632(auVar40));
    auVar71 = vsubps_avx(auVar57,auVar71);
    auVar55 = vsubps_avx512vl(auVar61,auVar55);
    auVar135 = ZEXT1632(auVar42);
    auVar62 = vsubps_avx512vl(auVar69,auVar135);
    auVar143 = ZEXT1632(auVar44);
    auVar63 = vsubps_avx512vl(auVar70,auVar143);
    auVar64 = vsubps_avx512vl(auVar57,auVar54);
    auVar62 = vaddps_avx512vl(auVar62,auVar64);
    auVar64 = vsubps_avx512vl(auVar61,auVar56);
    auVar63 = vaddps_avx512vl(auVar63,auVar64);
    auVar64 = vmulps_avx512vl(auVar143,auVar62);
    auVar64 = vfnmadd231ps_avx512vl(auVar64,auVar135,auVar63);
    auVar65 = vmulps_avx512vl(auVar58,auVar62);
    auVar65 = vfnmadd231ps_avx512vl(auVar65,auVar114,auVar63);
    auVar66 = vmulps_avx512vl(auVar59,auVar62);
    auVar66 = vfnmadd231ps_avx512vl(auVar66,auVar68,auVar63);
    auVar67 = vmulps_avx512vl(auVar56,auVar62);
    auVar67 = vfnmadd231ps_avx512vl(auVar67,auVar54,auVar63);
    auVar72 = vmulps_avx512vl(auVar70,auVar62);
    auVar72 = vfnmadd231ps_avx512vl(auVar72,auVar69,auVar63);
    auVar73 = vmulps_avx512vl(auVar60,auVar62);
    auVar73 = vfnmadd231ps_avx512vl(auVar73,auVar185,auVar63);
    auVar74 = vmulps_avx512vl(auVar55,auVar62);
    auVar74 = vfnmadd231ps_avx512vl(auVar74,auVar71,auVar63);
    auVar62 = vmulps_avx512vl(auVar61,auVar62);
    auVar62 = vfnmadd231ps_avx512vl(auVar62,auVar57,auVar63);
    auVar63 = vminps_avx512vl(auVar64,auVar65);
    auVar64 = vmaxps_avx512vl(auVar64,auVar65);
    auVar65 = vminps_avx512vl(auVar66,auVar67);
    auVar63 = vminps_avx512vl(auVar63,auVar65);
    auVar65 = vmaxps_avx512vl(auVar66,auVar67);
    auVar64 = vmaxps_avx512vl(auVar64,auVar65);
    auVar65 = vminps_avx512vl(auVar72,auVar73);
    auVar66 = vmaxps_avx512vl(auVar72,auVar73);
    auVar67 = vminps_avx512vl(auVar74,auVar62);
    auVar65 = vminps_avx512vl(auVar65,auVar67);
    auVar63 = vminps_avx512vl(auVar63,auVar65);
    auVar62 = vmaxps_avx512vl(auVar74,auVar62);
    auVar62 = vmaxps_avx512vl(auVar66,auVar62);
    auVar62 = vmaxps_avx512vl(auVar64,auVar62);
    uVar9 = vcmpps_avx512vl(auVar63,local_3c0,2);
    uVar10 = vcmpps_avx512vl(auVar62,local_3e0,5);
    uVar18 = 0;
    bVar14 = (byte)uVar9 & (byte)uVar10 & 0x7f;
    if (bVar14 != 0) {
      auVar62 = vsubps_avx512vl(auVar54,auVar135);
      auVar63 = vsubps_avx512vl(auVar56,auVar143);
      auVar64 = vsubps_avx512vl(auVar57,auVar69);
      auVar62 = vaddps_avx512vl(auVar62,auVar64);
      auVar64 = vsubps_avx512vl(auVar61,auVar70);
      auVar63 = vaddps_avx512vl(auVar63,auVar64);
      auVar64 = vmulps_avx512vl(auVar143,auVar62);
      auVar64 = vfnmadd231ps_avx512vl(auVar64,auVar63,auVar135);
      auVar58 = vmulps_avx512vl(auVar58,auVar62);
      auVar58 = vfnmadd213ps_avx512vl(auVar114,auVar63,auVar58);
      auVar59 = vmulps_avx512vl(auVar59,auVar62);
      auVar59 = vfnmadd213ps_avx512vl(auVar68,auVar63,auVar59);
      auVar68 = vmulps_avx512vl(auVar56,auVar62);
      auVar56 = vfnmadd231ps_avx512vl(auVar68,auVar63,auVar54);
      auVar68 = vmulps_avx512vl(auVar70,auVar62);
      auVar70 = vfnmadd231ps_avx512vl(auVar68,auVar63,auVar69);
      auVar68 = vmulps_avx512vl(auVar60,auVar62);
      auVar60 = vfnmadd213ps_avx512vl(auVar185,auVar63,auVar68);
      auVar68 = vmulps_avx512vl(auVar55,auVar62);
      auVar55 = vfnmadd213ps_avx512vl(auVar71,auVar63,auVar68);
      auVar71 = vmulps_avx512vl(auVar61,auVar62);
      auVar57 = vfnmadd231ps_avx512vl(auVar71,auVar57,auVar63);
      auVar68 = vminps_avx(auVar64,auVar58);
      auVar71 = vmaxps_avx(auVar64,auVar58);
      auVar54 = vminps_avx(auVar59,auVar56);
      auVar54 = vminps_avx(auVar68,auVar54);
      auVar68 = vmaxps_avx(auVar59,auVar56);
      auVar71 = vmaxps_avx(auVar71,auVar68);
      auVar69 = vminps_avx(auVar70,auVar60);
      auVar68 = vmaxps_avx(auVar70,auVar60);
      auVar70 = vminps_avx(auVar55,auVar57);
      auVar69 = vminps_avx(auVar69,auVar70);
      auVar69 = vminps_avx(auVar54,auVar69);
      auVar54 = vmaxps_avx(auVar55,auVar57);
      auVar68 = vmaxps_avx(auVar68,auVar54);
      auVar71 = vmaxps_avx(auVar71,auVar68);
      uVar9 = vcmpps_avx512vl(auVar71,local_3e0,5);
      uVar10 = vcmpps_avx512vl(auVar69,local_3c0,2);
      uVar18 = (uint)(bVar14 & (byte)uVar9 & (byte)uVar10);
    }
    if (uVar18 != 0) {
      auStack_600[uVar16] = uVar18;
      uVar9 = vmovlps_avx(auVar30);
      *(undefined8 *)(&uStack_460 + uVar16 * 2) = uVar9;
      uVar20 = vmovlps_avx512f(auVar43);
      auStack_3a0[uVar16] = uVar20;
      uVar16 = (ulong)((int)uVar16 + 1);
    }
    auVar30 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar103 = ZEXT1664(auVar30);
    auVar30 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar235 = ZEXT1664(auVar30);
    auVar76._0_32_ = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar76._32_32_ = auVar78._32_32_;
    in_ZMM19 = ZEXT3264(auVar76._0_32_);
    auVar236 = ZEXT464(0x3f800000);
    auVar77._16_48_ = auVar76._16_48_;
    auVar93 = auVar77;
    do {
      if ((int)uVar16 == 0) {
        if (bVar23) {
          return local_771;
        }
        uVar97 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar13._4_4_ = uVar97;
        auVar13._0_4_ = uVar97;
        auVar13._8_4_ = uVar97;
        auVar13._12_4_ = uVar97;
        uVar9 = vcmpps_avx512vl(local_580,auVar13,2);
        uVar22 = (uint)uVar25 & (uint)uVar25 + 0xf & (uint)uVar9;
        uVar25 = (ulong)uVar22;
        local_771 = uVar22 != 0;
        if (!local_771) {
          return local_771;
        }
        goto LAB_01b4532a;
      }
      uVar15 = (int)uVar16 - 1;
      uVar17 = (ulong)uVar15;
      uVar18 = (&uStack_460)[uVar17 * 2];
      fVar203 = afStack_45c[uVar17 * 2];
      uVar4 = auStack_600[uVar17];
      auVar217._8_8_ = 0;
      auVar217._0_8_ = auStack_3a0[uVar17];
      auVar75 = ZEXT1664(auVar217);
      lVar21 = 0;
      for (uVar20 = (ulong)uVar4; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
        lVar21 = lVar21 + 1;
      }
      uVar19 = uVar4 - 1 & uVar4;
      auStack_600[uVar17] = uVar19;
      if (uVar19 == 0) {
        uVar16 = (ulong)uVar15;
      }
      auVar40 = auVar238._0_16_;
      auVar30 = vcvtsi2ss_avx512f(auVar40,lVar21);
      auVar78._32_32_ = auVar93._32_32_;
      auVar28 = vmulss_avx512f(auVar30,SUB6416(ZEXT464(0x3e124925),0));
      lVar21 = lVar21 + 1;
      auVar30 = vcvtsi2ss_avx512f(auVar40,lVar21);
      auVar30 = vmulss_avx512f(auVar30,SUB6416(ZEXT464(0x3e124925),0));
      auVar35 = auVar236._0_16_;
      auVar34 = vsubss_avx512f(auVar35,auVar28);
      auVar28 = vmulss_avx512f(ZEXT416((uint)fVar203),auVar28);
      auVar94._0_16_ = vfmadd231ss_avx512f(auVar28,ZEXT416(uVar18),auVar34);
      auVar28 = vsubss_avx512f(auVar35,auVar30);
      auVar30 = vfmadd231ss_fma(ZEXT416((uint)(fVar203 * auVar30._0_4_)),ZEXT416(uVar18),auVar28);
      auVar28 = vsubss_avx512f(auVar30,auVar94._0_16_);
      vucomiss_avx512f(auVar28);
      if (uVar4 == 0 || lVar21 == 0) break;
      auVar34 = vshufps_avx(auVar217,auVar217,0x50);
      vucomiss_avx512f(auVar28);
      auVar42 = vsubps_avx512vl(auVar40,auVar34);
      fVar203 = auVar34._0_4_;
      auVar130._0_4_ = fVar180 * fVar203;
      fVar187 = auVar34._4_4_;
      auVar130._4_4_ = fVar186 * fVar187;
      fVar199 = auVar34._8_4_;
      auVar130._8_4_ = fVar180 * fVar199;
      fVar200 = auVar34._12_4_;
      auVar130._12_4_ = fVar186 * fVar200;
      auVar140._0_4_ = fVar157 * fVar203;
      auVar140._4_4_ = fVar169 * fVar187;
      auVar140._8_4_ = fVar157 * fVar199;
      auVar140._12_4_ = fVar169 * fVar200;
      auVar149._0_4_ = fVar212 * fVar203;
      auVar149._4_4_ = fVar213 * fVar187;
      auVar149._8_4_ = fVar212 * fVar199;
      auVar149._12_4_ = fVar213 * fVar200;
      auVar109._0_4_ = fVar214 * fVar203;
      auVar109._4_4_ = fVar215 * fVar187;
      auVar109._8_4_ = fVar214 * fVar199;
      auVar109._12_4_ = fVar215 * fVar200;
      auVar34 = vfmadd231ps_fma(auVar130,auVar42,auVar39);
      auVar41 = vfmadd231ps_fma(auVar140,auVar42,auVar32);
      auVar43 = vfmadd231ps_avx512vl(auVar149,auVar42,auVar107);
      auVar42 = vfmadd231ps_fma(auVar109,auVar173,auVar42);
      auVar58._16_16_ = auVar34;
      auVar58._0_16_ = auVar34;
      auVar61._16_16_ = auVar41;
      auVar61._0_16_ = auVar41;
      auVar63._16_16_ = auVar43;
      auVar63._0_16_ = auVar43;
      auVar64._0_4_ = auVar94._0_4_;
      auVar64._4_4_ = auVar64._0_4_;
      auVar64._8_4_ = auVar64._0_4_;
      auVar64._12_4_ = auVar64._0_4_;
      uVar97 = auVar30._0_4_;
      auVar64._20_4_ = uVar97;
      auVar64._16_4_ = uVar97;
      auVar64._24_4_ = uVar97;
      auVar64._28_4_ = uVar97;
      auVar71 = vsubps_avx(auVar61,auVar58);
      auVar41 = vfmadd213ps_fma(auVar71,auVar64,auVar58);
      auVar71 = vsubps_avx(auVar63,auVar61);
      auVar44 = vfmadd213ps_fma(auVar71,auVar64,auVar61);
      auVar34 = vsubps_avx(auVar42,auVar43);
      auVar62._16_16_ = auVar34;
      auVar62._0_16_ = auVar34;
      auVar34 = vfmadd213ps_fma(auVar62,auVar64,auVar63);
      auVar71 = vsubps_avx(ZEXT1632(auVar44),ZEXT1632(auVar41));
      auVar41 = vfmadd213ps_fma(auVar71,auVar64,ZEXT1632(auVar41));
      auVar71 = vsubps_avx(ZEXT1632(auVar34),ZEXT1632(auVar44));
      auVar34 = vfmadd213ps_fma(auVar71,auVar64,ZEXT1632(auVar44));
      auVar71 = vsubps_avx(ZEXT1632(auVar34),ZEXT1632(auVar41));
      auVar49 = vfmadd231ps_fma(ZEXT1632(auVar41),auVar71,auVar64);
      auVar78._0_32_ = vmulps_avx512vl(auVar71,in_ZMM19._0_32_);
      auVar80._16_48_ = auVar78._16_48_;
      auVar34 = vmulss_avx512f(auVar28,SUB6416(ZEXT464(0x3eaaaaab),0));
      fVar203 = auVar34._0_4_;
      auVar150._0_8_ =
           CONCAT44(auVar49._4_4_ + fVar203 * auVar78._4_4_,auVar49._0_4_ + fVar203 * auVar78._0_4_)
      ;
      auVar150._8_4_ = auVar49._8_4_ + fVar203 * auVar78._8_4_;
      auVar150._12_4_ = auVar49._12_4_ + fVar203 * auVar78._12_4_;
      auVar131._0_4_ = fVar203 * auVar78._16_4_;
      auVar131._4_4_ = fVar203 * auVar78._20_4_;
      auVar131._8_4_ = fVar203 * auVar78._24_4_;
      auVar131._12_4_ = fVar203 * auVar78._28_4_;
      auVar158 = vsubps_avx((undefined1  [16])0x0,auVar131);
      auVar52 = vshufpd_avx(auVar49,auVar49,3);
      auVar50 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar34 = vsubps_avx(auVar52,auVar49);
      auVar41 = vsubps_avx(auVar50,(undefined1  [16])0x0);
      auVar159._0_4_ = auVar41._0_4_ + auVar34._0_4_;
      auVar159._4_4_ = auVar41._4_4_ + auVar34._4_4_;
      auVar159._8_4_ = auVar41._8_4_ + auVar34._8_4_;
      auVar159._12_4_ = auVar41._12_4_ + auVar34._12_4_;
      auVar34 = vshufps_avx(auVar49,auVar49,0xb1);
      auVar41 = vshufps_avx(auVar150,auVar150,0xb1);
      auVar42 = vshufps_avx(auVar158,auVar158,0xb1);
      auVar44 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar218._4_4_ = auVar159._0_4_;
      auVar218._0_4_ = auVar159._0_4_;
      auVar218._8_4_ = auVar159._0_4_;
      auVar218._12_4_ = auVar159._0_4_;
      auVar43 = vshufps_avx(auVar159,auVar159,0x55);
      fVar203 = auVar43._0_4_;
      auVar174._0_4_ = auVar34._0_4_ * fVar203;
      fVar187 = auVar43._4_4_;
      auVar174._4_4_ = auVar34._4_4_ * fVar187;
      fVar199 = auVar43._8_4_;
      auVar174._8_4_ = auVar34._8_4_ * fVar199;
      fVar200 = auVar43._12_4_;
      auVar174._12_4_ = auVar34._12_4_ * fVar200;
      auVar182._0_4_ = auVar41._0_4_ * fVar203;
      auVar182._4_4_ = auVar41._4_4_ * fVar187;
      auVar182._8_4_ = auVar41._8_4_ * fVar199;
      auVar182._12_4_ = auVar41._12_4_ * fVar200;
      auVar191._0_4_ = auVar42._0_4_ * fVar203;
      auVar191._4_4_ = auVar42._4_4_ * fVar187;
      auVar191._8_4_ = auVar42._8_4_ * fVar199;
      auVar191._12_4_ = auVar42._12_4_ * fVar200;
      auVar160._0_4_ = auVar44._0_4_ * fVar203;
      auVar160._4_4_ = auVar44._4_4_ * fVar187;
      auVar160._8_4_ = auVar44._8_4_ * fVar199;
      auVar160._12_4_ = auVar44._12_4_ * fVar200;
      auVar34 = vfmadd231ps_fma(auVar174,auVar218,auVar49);
      auVar41 = vfmadd231ps_fma(auVar182,auVar218,auVar150);
      auVar43 = vfmadd231ps_fma(auVar191,auVar218,auVar158);
      auVar48 = vfmadd231ps_fma(auVar160,(undefined1  [16])0x0,auVar218);
      auVar51 = vshufpd_avx(auVar34,auVar34,1);
      auVar45 = vshufpd_avx(auVar41,auVar41,1);
      auVar46 = vshufpd_avx(auVar43,auVar43,1);
      auVar47 = vshufpd_avx(auVar48,auVar48,1);
      auVar42 = vminss_avx(auVar34,auVar41);
      auVar34 = vmaxss_avx(auVar41,auVar34);
      auVar44 = vminss_avx(auVar43,auVar48);
      auVar41 = vmaxss_avx(auVar48,auVar43);
      auVar44 = vminss_avx(auVar42,auVar44);
      auVar34 = vmaxss_avx(auVar41,auVar34);
      auVar43 = vminss_avx(auVar51,auVar45);
      auVar41 = vmaxss_avx(auVar45,auVar51);
      auVar51 = vminss_avx(auVar46,auVar47);
      auVar42 = vmaxss_avx(auVar47,auVar46);
      auVar43 = vminss_avx(auVar43,auVar51);
      auVar41 = vmaxss_avx(auVar42,auVar41);
      vucomiss_avx512f(auVar44);
      fVar187 = auVar41._0_4_;
      fVar203 = auVar34._0_4_;
      if (((uint)uVar16 < 5) || (fVar187 <= -0.0001)) {
        uVar9 = vcmpps_avx512vl(auVar43,SUB6416(ZEXT464(0x38d1b717),0),1);
        uVar10 = vcmpps_avx512vl(auVar44,SUB6416(ZEXT464(0x38d1b717),0),1);
        if ((-0.0001 < fVar203 & ((byte)uVar10 | (byte)uVar9)) != 0) goto LAB_01b46221;
        uVar9 = vcmpps_avx512vl(SUB6416(ZEXT464(0xb8d1b717),0),auVar41,5);
        uVar10 = vcmpps_avx512vl(auVar43,SUB6416(ZEXT464(0x38d1b717),0),5);
        if ((((ushort)uVar10 | (ushort)uVar9) & 1) == 0) goto LAB_01b46221;
LAB_01b47009:
        bVar11 = true;
        auVar75 = ZEXT1664(auVar217);
        auVar94._16_48_ = auVar80._16_48_;
        auVar93 = auVar94;
      }
      else {
LAB_01b46221:
        auVar45 = auVar240._0_16_;
        uVar9 = vcmpss_avx512f(auVar44,auVar45,1);
        bVar11 = (bool)((byte)uVar9 & 1);
        iVar95 = auVar236._0_4_;
        fVar199 = (float)((uint)bVar11 * -0x40800000 + (uint)!bVar11 * iVar95);
        uVar9 = vcmpss_avx512f(auVar34,auVar45,1);
        bVar11 = (bool)((byte)uVar9 & 1);
        fVar200 = (float)((uint)bVar11 * -0x40800000 + (uint)!bVar11 * iVar95);
        bVar11 = fVar199 != fVar200;
        iVar239 = auVar240._0_4_;
        auVar80._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar79._4_60_ = auVar80._4_60_;
        auVar79._0_4_ = (uint)bVar11 * iVar239 + (uint)!bVar11 * 0x7f800000;
        auVar51 = auVar79._0_16_;
        auVar82._16_48_ = auVar80._16_48_;
        auVar82._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar81._4_60_ = auVar82._4_60_;
        auVar81._0_4_ = (uint)bVar11 * iVar239 + (uint)!bVar11 * -0x800000;
        auVar42 = auVar81._0_16_;
        uVar9 = vcmpss_avx512f(auVar43,auVar45,1);
        bVar11 = (bool)((byte)uVar9 & 1);
        fVar201 = (float)((uint)bVar11 * -0x40800000 + (uint)!bVar11 * iVar95);
        if ((fVar199 != fVar201) || (NAN(fVar199) || NAN(fVar201))) {
          fVar202 = auVar43._0_4_;
          fVar199 = auVar44._0_4_;
          bVar11 = fVar202 == fVar199;
          if ((!bVar11) || (NAN(fVar202) || NAN(fVar199))) {
            auVar44 = vxorps_avx512vl(auVar44,auVar235._0_16_);
            auVar230._0_4_ = auVar44._0_4_ / (fVar202 - fVar199);
            auVar230._4_12_ = auVar44._4_12_;
            auVar44 = vsubss_avx512f(auVar35,auVar230);
            auVar43 = vfmadd213ss_avx512f(auVar44,auVar45,auVar230);
            auVar44 = auVar43;
          }
          else {
            vucomiss_avx512f(auVar45);
            auVar84._16_48_ = auVar80._16_48_;
            auVar84._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar83._4_60_ = auVar84._4_60_;
            auVar83._0_4_ = (uint)bVar11 * iVar239 + (uint)!bVar11 * 0x7f800000;
            auVar43 = auVar83._0_16_;
            auVar44 = ZEXT416((uint)bVar11 * 0x3f800000 + (uint)!bVar11 * -0x800000);
          }
          auVar51 = vminss_avx(auVar51,auVar43);
          auVar42 = vmaxss_avx(auVar44,auVar42);
        }
        uVar9 = vcmpss_avx512f(auVar41,auVar45,1);
        bVar11 = (bool)((byte)uVar9 & 1);
        fVar199 = (float)((uint)bVar11 * -0x40800000 + (uint)!bVar11 * iVar95);
        if ((fVar200 != fVar199) || (NAN(fVar200) || NAN(fVar199))) {
          bVar11 = fVar187 == fVar203;
          if ((!bVar11) || (NAN(fVar187) || NAN(fVar203))) {
            auVar34 = vxorps_avx512vl(auVar34,auVar235._0_16_);
            auVar192._0_4_ = auVar34._0_4_ / (fVar187 - fVar203);
            auVar192._4_12_ = auVar34._4_12_;
            auVar34 = vsubss_avx512f(auVar35,auVar192);
            auVar41 = vfmadd213ss_avx512f(auVar34,auVar45,auVar192);
            auVar34 = auVar41;
          }
          else {
            vucomiss_avx512f(auVar45);
            auVar86._16_48_ = auVar80._16_48_;
            auVar86._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar85._4_60_ = auVar86._4_60_;
            auVar85._0_4_ = (uint)bVar11 * iVar239 + (uint)!bVar11 * 0x7f800000;
            auVar41 = auVar85._0_16_;
            auVar34 = ZEXT416((uint)bVar11 * 0x3f800000 + (uint)!bVar11 * -0x800000);
          }
          auVar51 = vminss_avx(auVar51,auVar41);
          auVar42 = vmaxss_avx(auVar34,auVar42);
        }
        bVar11 = fVar201 != fVar199;
        auVar34 = vminss_avx512f(auVar51,auVar35);
        auVar88._16_48_ = auVar80._16_48_;
        auVar88._0_16_ = auVar51;
        auVar87._4_60_ = auVar88._4_60_;
        auVar87._0_4_ = (uint)bVar11 * auVar34._0_4_ + (uint)!bVar11 * auVar51._0_4_;
        auVar34 = vmaxss_avx512f(auVar35,auVar42);
        auVar90._16_48_ = auVar80._16_48_;
        auVar90._0_16_ = auVar42;
        auVar89._4_60_ = auVar90._4_60_;
        auVar89._0_4_ = (uint)bVar11 * auVar34._0_4_ + (uint)!bVar11 * auVar42._0_4_;
        auVar34 = vmaxss_avx512f(auVar45,auVar87._0_16_);
        auVar41 = vminss_avx512f(auVar89._0_16_,auVar35);
        bVar11 = true;
        if (auVar41._0_4_ < auVar34._0_4_) goto LAB_01b47009;
        auVar45 = vmaxss_avx512f(auVar45,ZEXT416((uint)(auVar34._0_4_ + -0.1)));
        auVar46 = vminss_avx512f(ZEXT416((uint)(auVar41._0_4_ + 0.1)),auVar35);
        auVar110._0_8_ = auVar49._0_8_;
        auVar110._8_8_ = auVar110._0_8_;
        auVar183._8_8_ = auVar150._0_8_;
        auVar183._0_8_ = auVar150._0_8_;
        auVar193._8_8_ = auVar158._0_8_;
        auVar193._0_8_ = auVar158._0_8_;
        auVar34 = vshufpd_avx(auVar150,auVar150,3);
        auVar41 = vshufpd_avx(auVar158,auVar158,3);
        auVar42 = vshufps_avx(auVar45,auVar46,0);
        auVar47 = vsubps_avx512vl(auVar40,auVar42);
        fVar203 = auVar42._0_4_;
        auVar228._0_4_ = fVar203 * auVar52._0_4_;
        fVar187 = auVar42._4_4_;
        auVar228._4_4_ = fVar187 * auVar52._4_4_;
        fVar199 = auVar42._8_4_;
        auVar228._8_4_ = fVar199 * auVar52._8_4_;
        fVar200 = auVar42._12_4_;
        auVar228._12_4_ = fVar200 * auVar52._12_4_;
        auVar151._0_4_ = fVar203 * auVar34._0_4_;
        auVar151._4_4_ = fVar187 * auVar34._4_4_;
        auVar151._8_4_ = fVar199 * auVar34._8_4_;
        auVar151._12_4_ = fVar200 * auVar34._12_4_;
        auVar154._0_4_ = fVar203 * auVar41._0_4_;
        auVar154._4_4_ = fVar187 * auVar41._4_4_;
        auVar154._8_4_ = fVar199 * auVar41._8_4_;
        auVar154._12_4_ = fVar200 * auVar41._12_4_;
        auVar132._0_4_ = fVar203 * auVar50._0_4_;
        auVar132._4_4_ = fVar187 * auVar50._4_4_;
        auVar132._8_4_ = fVar199 * auVar50._8_4_;
        auVar132._12_4_ = fVar200 * auVar50._12_4_;
        auVar44 = vfmadd231ps_fma(auVar228,auVar47,auVar110);
        auVar43 = vfmadd231ps_fma(auVar151,auVar47,auVar183);
        auVar51 = vfmadd231ps_fma(auVar154,auVar47,auVar193);
        auVar52 = vfmadd231ps_fma(auVar132,auVar47,ZEXT816(0));
        auVar34 = vsubss_avx512f(auVar35,auVar45);
        auVar41 = vmovshdup_avx512vl(auVar217);
        auVar48 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar41._0_4_ * auVar45._0_4_)),auVar217,
                                      auVar34);
        auVar34 = vsubss_avx512f(auVar35,auVar46);
        auVar49 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar46._0_4_ * auVar41._0_4_)),auVar217,
                                      auVar34);
        auVar50 = vdivss_avx512f(auVar35,auVar28);
        auVar28 = vsubps_avx(auVar43,auVar44);
        auVar99 = auVar103._0_16_;
        auVar41 = vmulps_avx512vl(auVar28,auVar99);
        auVar28 = vsubps_avx(auVar51,auVar43);
        auVar42 = vmulps_avx512vl(auVar28,auVar99);
        auVar28 = vsubps_avx(auVar52,auVar51);
        auVar28 = vmulps_avx512vl(auVar28,auVar99);
        auVar34 = vminps_avx(auVar42,auVar28);
        auVar28 = vmaxps_avx(auVar42,auVar28);
        auVar34 = vminps_avx(auVar41,auVar34);
        auVar28 = vmaxps_avx(auVar41,auVar28);
        auVar41 = vshufpd_avx(auVar34,auVar34,3);
        auVar42 = vshufpd_avx(auVar28,auVar28,3);
        auVar34 = vminps_avx(auVar34,auVar41);
        auVar28 = vmaxps_avx(auVar28,auVar42);
        fVar203 = auVar50._0_4_;
        auVar175._0_4_ = fVar203 * auVar34._0_4_;
        auVar175._4_4_ = fVar203 * auVar34._4_4_;
        auVar175._8_4_ = fVar203 * auVar34._8_4_;
        auVar175._12_4_ = fVar203 * auVar34._12_4_;
        auVar161._0_4_ = fVar203 * auVar28._0_4_;
        auVar161._4_4_ = fVar203 * auVar28._4_4_;
        auVar161._8_4_ = fVar203 * auVar28._8_4_;
        auVar161._12_4_ = fVar203 * auVar28._12_4_;
        auVar50 = vdivss_avx512f(auVar35,ZEXT416((uint)(auVar49._0_4_ - auVar48._0_4_)));
        auVar28 = vshufpd_avx(auVar44,auVar44,3);
        auVar34 = vshufpd_avx(auVar43,auVar43,3);
        auVar41 = vshufpd_avx(auVar51,auVar51,3);
        auVar42 = vshufpd_avx(auVar52,auVar52,3);
        auVar28 = vsubps_avx(auVar28,auVar44);
        auVar44 = vsubps_avx(auVar34,auVar43);
        auVar43 = vsubps_avx(auVar41,auVar51);
        auVar42 = vsubps_avx(auVar42,auVar52);
        auVar34 = vminps_avx(auVar28,auVar44);
        auVar28 = vmaxps_avx(auVar28,auVar44);
        auVar41 = vminps_avx(auVar43,auVar42);
        auVar41 = vminps_avx(auVar34,auVar41);
        auVar34 = vmaxps_avx(auVar43,auVar42);
        auVar28 = vmaxps_avx(auVar28,auVar34);
        fVar203 = auVar50._0_4_;
        auVar194._0_4_ = fVar203 * auVar41._0_4_;
        auVar194._4_4_ = fVar203 * auVar41._4_4_;
        auVar194._8_4_ = fVar203 * auVar41._8_4_;
        auVar194._12_4_ = fVar203 * auVar41._12_4_;
        auVar206._0_4_ = fVar203 * auVar28._0_4_;
        auVar206._4_4_ = fVar203 * auVar28._4_4_;
        auVar206._8_4_ = fVar203 * auVar28._8_4_;
        auVar206._12_4_ = fVar203 * auVar28._12_4_;
        auVar158 = vinsertps_avx512f(auVar94._0_16_,auVar48,0x10);
        auVar44 = vinsertps_avx(auVar30,auVar49,0x10);
        auVar102._0_4_ = auVar158._0_4_ + auVar44._0_4_;
        auVar102._4_4_ = auVar158._4_4_ + auVar44._4_4_;
        auVar102._8_4_ = auVar158._8_4_ + auVar44._8_4_;
        auVar102._12_4_ = auVar158._12_4_ + auVar44._12_4_;
        auVar12._8_4_ = 0x3f000000;
        auVar12._0_8_ = 0x3f0000003f000000;
        auVar12._12_4_ = 0x3f000000;
        auVar46 = vmulps_avx512vl(auVar102,auVar12);
        auVar41 = vshufps_avx(auVar46,auVar46,0x54);
        uVar97 = auVar46._0_4_;
        auVar125._4_4_ = uVar97;
        auVar125._0_4_ = uVar97;
        auVar125._8_4_ = uVar97;
        auVar125._12_4_ = uVar97;
        auVar34 = vfmadd213ps_fma(auVar29,auVar125,auVar26);
        auVar43 = vfmadd213ps_avx512vl(auVar77._0_16_,auVar125,auVar31);
        auVar42 = vfmadd213ps_fma(local_470,auVar125,auVar27);
        auVar28 = vsubps_avx(auVar43,auVar34);
        auVar34 = vfmadd213ps_fma(auVar28,auVar125,auVar34);
        auVar28 = vsubps_avx(auVar42,auVar43);
        auVar28 = vfmadd213ps_fma(auVar28,auVar125,auVar43);
        auVar28 = vsubps_avx(auVar28,auVar34);
        auVar34 = vfmadd231ps_fma(auVar34,auVar28,auVar125);
        auVar51 = vmulps_avx512vl(auVar28,auVar99);
        auVar219._8_8_ = auVar34._0_8_;
        auVar219._0_8_ = auVar34._0_8_;
        auVar28 = vshufpd_avx(auVar34,auVar34,3);
        auVar34 = vshufps_avx(auVar46,auVar46,0x55);
        auVar42 = vsubps_avx(auVar28,auVar219);
        auVar43 = vfmadd231ps_fma(auVar219,auVar34,auVar42);
        auVar231._8_8_ = auVar51._0_8_;
        auVar231._0_8_ = auVar51._0_8_;
        auVar28 = vshufpd_avx(auVar51,auVar51,3);
        auVar28 = vsubps_avx(auVar28,auVar231);
        auVar34 = vfmadd213ps_fma(auVar28,auVar34,auVar231);
        auVar126._0_8_ = auVar42._0_8_ ^ 0x8000000080000000;
        auVar126._8_4_ = auVar42._8_4_ ^ 0x80000000;
        auVar126._12_4_ = auVar42._12_4_ ^ 0x80000000;
        auVar28 = vmovshdup_avx(auVar34);
        auVar232._0_8_ = auVar28._0_8_ ^ 0x8000000080000000;
        auVar232._8_4_ = auVar28._8_4_ ^ 0x80000000;
        auVar232._12_4_ = auVar28._12_4_ ^ 0x80000000;
        auVar51 = vmovshdup_avx512vl(auVar42);
        auVar52 = vpermt2ps_avx512vl(auVar232,ZEXT416(5),auVar42);
        auVar28 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar28._0_4_ * auVar42._0_4_)),auVar34,auVar51
                                     );
        auVar34 = vpermt2ps_avx512vl(auVar34,SUB6416(ZEXT464(4),0),auVar126);
        auVar133._0_4_ = auVar28._0_4_;
        auVar133._4_4_ = auVar133._0_4_;
        auVar133._8_4_ = auVar133._0_4_;
        auVar133._12_4_ = auVar133._0_4_;
        auVar28 = vdivps_avx(auVar52,auVar133);
        auVar34 = vdivps_avx(auVar34,auVar133);
        fVar187 = auVar43._0_4_;
        auVar42 = vshufps_avx(auVar43,auVar43,0x55);
        fVar203 = auVar34._0_4_;
        auVar220._0_4_ = fVar187 * auVar28._0_4_ + auVar42._0_4_ * fVar203;
        auVar220._4_4_ = fVar187 * auVar28._4_4_ + auVar42._4_4_ * auVar34._4_4_;
        auVar220._8_4_ = fVar187 * auVar28._8_4_ + auVar42._8_4_ * auVar34._8_4_;
        auVar220._12_4_ = fVar187 * auVar28._12_4_ + auVar42._12_4_ * auVar34._12_4_;
        auVar47 = vsubps_avx(auVar41,auVar220);
        auVar43 = vmovshdup_avx(auVar28);
        auVar41 = vinsertps_avx(auVar175,auVar194,0x1c);
        auVar233._0_4_ = auVar43._0_4_ * auVar41._0_4_;
        auVar233._4_4_ = auVar43._4_4_ * auVar41._4_4_;
        auVar233._8_4_ = auVar43._8_4_ * auVar41._8_4_;
        auVar233._12_4_ = auVar43._12_4_ * auVar41._12_4_;
        auVar42 = vinsertps_avx(auVar161,auVar206,0x1c);
        auVar221._0_4_ = auVar43._0_4_ * auVar42._0_4_;
        auVar221._4_4_ = auVar43._4_4_ * auVar42._4_4_;
        auVar221._8_4_ = auVar43._8_4_ * auVar42._8_4_;
        auVar221._12_4_ = auVar43._12_4_ * auVar42._12_4_;
        auVar45 = vminps_avx512vl(auVar233,auVar221);
        auVar52 = vmaxps_avx(auVar221,auVar233);
        auVar50 = vmovshdup_avx(auVar34);
        auVar43 = vinsertps_avx(auVar194,auVar175,0x4c);
        auVar195._0_4_ = auVar50._0_4_ * auVar43._0_4_;
        auVar195._4_4_ = auVar50._4_4_ * auVar43._4_4_;
        auVar195._8_4_ = auVar50._8_4_ * auVar43._8_4_;
        auVar195._12_4_ = auVar50._12_4_ * auVar43._12_4_;
        auVar51 = vinsertps_avx(auVar206,auVar161,0x4c);
        auVar207._0_4_ = auVar50._0_4_ * auVar51._0_4_;
        auVar207._4_4_ = auVar50._4_4_ * auVar51._4_4_;
        auVar207._8_4_ = auVar50._8_4_ * auVar51._8_4_;
        auVar207._12_4_ = auVar50._12_4_ * auVar51._12_4_;
        auVar50 = vminps_avx(auVar195,auVar207);
        auVar45 = vaddps_avx512vl(auVar45,auVar50);
        auVar50 = vmaxps_avx(auVar207,auVar195);
        auVar196._0_4_ = auVar52._0_4_ + auVar50._0_4_;
        auVar196._4_4_ = auVar52._4_4_ + auVar50._4_4_;
        auVar196._8_4_ = auVar52._8_4_ + auVar50._8_4_;
        auVar196._12_4_ = auVar52._12_4_ + auVar50._12_4_;
        auVar208._8_8_ = 0x3f80000000000000;
        auVar208._0_8_ = 0x3f80000000000000;
        auVar52 = vsubps_avx(auVar208,auVar196);
        auVar50 = vsubps_avx(auVar208,auVar45);
        auVar45 = vsubps_avx(auVar158,auVar46);
        auVar46 = vsubps_avx(auVar44,auVar46);
        fVar202 = auVar45._0_4_;
        auVar234._0_4_ = fVar202 * auVar52._0_4_;
        fVar204 = auVar45._4_4_;
        auVar234._4_4_ = fVar204 * auVar52._4_4_;
        fVar223 = auVar45._8_4_;
        auVar234._8_4_ = fVar223 * auVar52._8_4_;
        fVar224 = auVar45._12_4_;
        auVar234._12_4_ = fVar224 * auVar52._12_4_;
        auVar53 = vbroadcastss_avx512vl(auVar28);
        auVar41 = vmulps_avx512vl(auVar53,auVar41);
        auVar42 = vmulps_avx512vl(auVar53,auVar42);
        auVar53 = vminps_avx512vl(auVar41,auVar42);
        auVar41 = vmaxps_avx(auVar42,auVar41);
        auVar176._0_4_ = fVar203 * auVar43._0_4_;
        auVar176._4_4_ = fVar203 * auVar43._4_4_;
        auVar176._8_4_ = fVar203 * auVar43._8_4_;
        auVar176._12_4_ = fVar203 * auVar43._12_4_;
        auVar162._0_4_ = fVar203 * auVar51._0_4_;
        auVar162._4_4_ = fVar203 * auVar51._4_4_;
        auVar162._8_4_ = fVar203 * auVar51._8_4_;
        auVar162._12_4_ = fVar203 * auVar51._12_4_;
        auVar42 = vminps_avx(auVar176,auVar162);
        auVar43 = vaddps_avx512vl(auVar53,auVar42);
        auVar51 = vmulps_avx512vl(auVar45,auVar50);
        fVar187 = auVar46._0_4_;
        auVar197._0_4_ = fVar187 * auVar52._0_4_;
        fVar199 = auVar46._4_4_;
        auVar197._4_4_ = fVar199 * auVar52._4_4_;
        fVar200 = auVar46._8_4_;
        auVar197._8_4_ = fVar200 * auVar52._8_4_;
        fVar201 = auVar46._12_4_;
        auVar197._12_4_ = fVar201 * auVar52._12_4_;
        auVar209._0_4_ = fVar187 * auVar50._0_4_;
        auVar209._4_4_ = fVar199 * auVar50._4_4_;
        auVar209._8_4_ = fVar200 * auVar50._8_4_;
        auVar209._12_4_ = fVar201 * auVar50._12_4_;
        auVar42 = vmaxps_avx(auVar162,auVar176);
        auVar163._0_4_ = auVar41._0_4_ + auVar42._0_4_;
        auVar163._4_4_ = auVar41._4_4_ + auVar42._4_4_;
        auVar163._8_4_ = auVar41._8_4_ + auVar42._8_4_;
        auVar163._12_4_ = auVar41._12_4_ + auVar42._12_4_;
        auVar177._8_8_ = 0x3f800000;
        auVar177._0_8_ = 0x3f800000;
        auVar41 = vsubps_avx(auVar177,auVar163);
        auVar42 = vsubps_avx(auVar177,auVar43);
        auVar229._0_4_ = fVar202 * auVar41._0_4_;
        auVar229._4_4_ = fVar204 * auVar41._4_4_;
        auVar229._8_4_ = fVar223 * auVar41._8_4_;
        auVar229._12_4_ = fVar224 * auVar41._12_4_;
        auVar222._0_4_ = fVar202 * auVar42._0_4_;
        auVar222._4_4_ = fVar204 * auVar42._4_4_;
        auVar222._8_4_ = fVar223 * auVar42._8_4_;
        auVar222._12_4_ = fVar224 * auVar42._12_4_;
        auVar164._0_4_ = fVar187 * auVar41._0_4_;
        auVar164._4_4_ = fVar199 * auVar41._4_4_;
        auVar164._8_4_ = fVar200 * auVar41._8_4_;
        auVar164._12_4_ = fVar201 * auVar41._12_4_;
        auVar178._0_4_ = fVar187 * auVar42._0_4_;
        auVar178._4_4_ = fVar199 * auVar42._4_4_;
        auVar178._8_4_ = fVar200 * auVar42._8_4_;
        auVar178._12_4_ = fVar201 * auVar42._12_4_;
        auVar41 = vminps_avx(auVar229,auVar222);
        auVar42 = vminps_avx(auVar164,auVar178);
        auVar43 = vminps_avx(auVar41,auVar42);
        auVar41 = vmaxps_avx(auVar222,auVar229);
        auVar42 = vmaxps_avx(auVar178,auVar164);
        auVar42 = vmaxps_avx(auVar42,auVar41);
        auVar52 = vminps_avx512vl(auVar234,auVar51);
        auVar41 = vminps_avx(auVar197,auVar209);
        auVar41 = vminps_avx(auVar52,auVar41);
        auVar41 = vhaddps_avx(auVar43,auVar41);
        auVar51 = vmaxps_avx512vl(auVar51,auVar234);
        auVar43 = vmaxps_avx(auVar209,auVar197);
        auVar43 = vmaxps_avx(auVar43,auVar51);
        auVar42 = vhaddps_avx(auVar42,auVar43);
        auVar41 = vshufps_avx(auVar41,auVar41,0xe8);
        auVar42 = vshufps_avx(auVar42,auVar42,0xe8);
        auVar165._0_4_ = auVar41._0_4_ + auVar47._0_4_;
        auVar165._4_4_ = auVar41._4_4_ + auVar47._4_4_;
        auVar165._8_4_ = auVar41._8_4_ + auVar47._8_4_;
        auVar165._12_4_ = auVar41._12_4_ + auVar47._12_4_;
        auVar179._0_4_ = auVar42._0_4_ + auVar47._0_4_;
        auVar179._4_4_ = auVar42._4_4_ + auVar47._4_4_;
        auVar179._8_4_ = auVar42._8_4_ + auVar47._8_4_;
        auVar179._12_4_ = auVar42._12_4_ + auVar47._12_4_;
        auVar41 = vmaxps_avx(auVar158,auVar165);
        auVar42 = vminps_avx(auVar179,auVar44);
        uVar20 = vcmpps_avx512vl(auVar42,auVar41,1);
        auVar41 = vinsertps_avx(auVar48,auVar49,0x10);
        auVar75 = ZEXT1664(auVar41);
        auVar42 = ZEXT416(5);
        if ((uVar20 & 3) == 0) {
          vucomiss_avx512f(auVar94._0_16_);
          auVar91._0_16_ = vxorps_avx512vl(auVar42,auVar42);
          auVar91._16_48_ = auVar80._16_48_;
          auVar240 = ZEXT1664(auVar91._0_16_);
          local_630 = auVar33._0_4_;
          fStack_62c = auVar33._4_4_;
          fStack_628 = auVar33._8_4_;
          fStack_624 = auVar33._12_4_;
          if ((uint)uVar16 < 4 && (uVar4 == 0 || lVar21 == 0)) {
            bVar11 = false;
            auVar93 = auVar91;
          }
          else {
            lVar21 = 200;
            auVar93 = auVar91;
            do {
              auVar42 = vsubss_avx512f(auVar35,auVar47);
              fVar200 = auVar42._0_4_;
              fVar187 = fVar200 * fVar200 * fVar200;
              fVar201 = auVar47._0_4_;
              fVar199 = fVar201 * 3.0 * fVar200 * fVar200;
              fVar200 = fVar200 * fVar201 * fVar201 * 3.0;
              auVar152._4_4_ = fVar187;
              auVar152._0_4_ = fVar187;
              auVar152._8_4_ = fVar187;
              auVar152._12_4_ = fVar187;
              auVar141._4_4_ = fVar199;
              auVar141._0_4_ = fVar199;
              auVar141._8_4_ = fVar199;
              auVar141._12_4_ = fVar199;
              auVar111._4_4_ = fVar200;
              auVar111._0_4_ = fVar200;
              auVar111._8_4_ = fVar200;
              auVar111._12_4_ = fVar200;
              fVar201 = fVar201 * fVar201 * fVar201;
              auVar155._0_4_ = local_630 * fVar201;
              auVar155._4_4_ = fStack_62c * fVar201;
              auVar155._8_4_ = fStack_628 * fVar201;
              auVar155._12_4_ = fStack_624 * fVar201;
              auVar42 = vfmadd231ps_fma(auVar155,auVar27,auVar111);
              auVar42 = vfmadd231ps_fma(auVar42,auVar31,auVar141);
              auVar42 = vfmadd231ps_fma(auVar42,auVar26,auVar152);
              auVar112._8_8_ = auVar42._0_8_;
              auVar112._0_8_ = auVar42._0_8_;
              auVar42 = vshufpd_avx(auVar42,auVar42,3);
              auVar44 = vshufps_avx(auVar47,auVar47,0x55);
              auVar42 = vsubps_avx(auVar42,auVar112);
              auVar44 = vfmadd213ps_fma(auVar42,auVar44,auVar112);
              fVar187 = auVar44._0_4_;
              auVar42 = vshufps_avx(auVar44,auVar44,0x55);
              auVar113._0_4_ = auVar28._0_4_ * fVar187 + fVar203 * auVar42._0_4_;
              auVar113._4_4_ = auVar28._4_4_ * fVar187 + auVar34._4_4_ * auVar42._4_4_;
              auVar113._8_4_ = auVar28._8_4_ * fVar187 + auVar34._8_4_ * auVar42._8_4_;
              auVar113._12_4_ = auVar28._12_4_ * fVar187 + auVar34._12_4_ * auVar42._12_4_;
              auVar47 = vsubps_avx(auVar47,auVar113);
              auVar42 = vandps_avx512vl(auVar44,auVar237._0_16_);
              auVar93._0_16_ = vprolq_avx512vl(auVar42,0x20);
              auVar42 = vmaxss_avx(auVar93._0_16_,auVar42);
              bVar24 = auVar42._0_4_ <= fVar104;
              if (auVar42._0_4_ < fVar104) {
                auVar28 = vucomiss_avx512f(auVar91._0_16_);
                if (bVar24) {
                  auVar34 = vucomiss_avx512f(auVar28);
                  auVar236 = ZEXT1664(auVar34);
                  auVar75 = ZEXT1664(auVar41);
                  if (bVar24) {
                    vmovshdup_avx(auVar28);
                    auVar34 = vucomiss_avx512f(auVar91._0_16_);
                    if (bVar24) {
                      auVar35 = vucomiss_avx512f(auVar34);
                      auVar236 = ZEXT1664(auVar35);
                      if (bVar24) {
                        auVar42 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                                ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),
                                                0x1c);
                        auVar46 = vinsertps_avx(auVar42,ZEXT416((uint)pre->ray_space[k].vz.field_0.
                                                                      m128[2]),0x28);
                        auVar42 = vdpps_avx(auVar46,local_480,0x7f);
                        auVar44 = vdpps_avx(auVar46,local_490,0x7f);
                        auVar43 = vdpps_avx(auVar46,local_4a0,0x7f);
                        auVar51 = vdpps_avx(auVar46,local_4b0,0x7f);
                        auVar52 = vdpps_avx(auVar46,local_4c0,0x7f);
                        auVar50 = vdpps_avx(auVar46,local_4d0,0x7f);
                        auVar45 = vdpps_avx(auVar46,local_4e0,0x7f);
                        auVar46 = vdpps_avx(auVar46,local_4f0,0x7f);
                        auVar47 = vsubss_avx512f(auVar35,auVar34);
                        fVar203 = auVar34._0_4_;
                        auVar34 = vfmadd231ss_fma(ZEXT416((uint)(fVar203 * auVar52._0_4_)),auVar47,
                                                  auVar42);
                        auVar42 = vfmadd231ss_fma(ZEXT416((uint)(auVar50._0_4_ * fVar203)),auVar47,
                                                  auVar44);
                        auVar44 = vfmadd231ss_fma(ZEXT416((uint)(auVar45._0_4_ * fVar203)),auVar47,
                                                  auVar43);
                        auVar43 = vfmadd231ss_fma(ZEXT416((uint)(fVar203 * auVar46._0_4_)),auVar47,
                                                  auVar51);
                        auVar93._0_16_ = vsubss_avx512f(auVar35,auVar28);
                        auVar156._0_4_ = auVar93._0_4_;
                        fVar203 = auVar156._0_4_ * auVar156._0_4_ * auVar156._0_4_;
                        fVar200 = auVar28._0_4_;
                        fVar187 = fVar200 * 3.0 * auVar156._0_4_ * auVar156._0_4_;
                        fVar199 = auVar156._0_4_ * fVar200 * fVar200 * 3.0;
                        fVar202 = fVar200 * fVar200 * fVar200;
                        auVar35 = vfmadd231ss_fma(ZEXT416((uint)(fVar202 * auVar43._0_4_)),
                                                  ZEXT416((uint)fVar199),auVar44);
                        auVar35 = vfmadd231ss_fma(auVar35,ZEXT416((uint)fVar187),auVar42);
                        auVar34 = vfmadd231ss_fma(auVar35,ZEXT416((uint)fVar203),auVar34);
                        fVar201 = auVar34._0_4_;
                        if ((fVar96 <= fVar201) &&
                           (fVar204 = *(float *)(ray + k * 4 + 0x200), fVar201 <= fVar204)) {
                          auVar34 = vshufps_avx(auVar28,auVar28,0x55);
                          auVar42 = vsubps_avx512vl(auVar40,auVar34);
                          fVar223 = auVar34._0_4_;
                          auVar184._0_4_ = fVar223 * (float)local_510._0_4_;
                          fVar224 = auVar34._4_4_;
                          auVar184._4_4_ = fVar224 * (float)local_510._4_4_;
                          fVar225 = auVar34._8_4_;
                          auVar184._8_4_ = fVar225 * fStack_508;
                          fVar170 = auVar34._12_4_;
                          auVar184._12_4_ = fVar170 * fStack_504;
                          auVar198._0_4_ = fVar223 * (float)local_560._0_4_;
                          auVar198._4_4_ = fVar224 * (float)local_560._4_4_;
                          auVar198._8_4_ = fVar225 * fStack_558;
                          auVar198._12_4_ = fVar170 * fStack_554;
                          auVar210._0_4_ = fVar223 * (float)local_570._0_4_;
                          auVar210._4_4_ = fVar224 * (float)local_570._4_4_;
                          auVar210._8_4_ = fVar225 * fStack_568;
                          auVar210._12_4_ = fVar170 * fStack_564;
                          auVar166._0_4_ = fVar223 * (float)local_530._0_4_;
                          auVar166._4_4_ = fVar224 * (float)local_530._4_4_;
                          auVar166._8_4_ = fVar225 * fStack_528;
                          auVar166._12_4_ = fVar170 * fStack_524;
                          auVar34 = vfmadd231ps_fma(auVar184,auVar42,local_500);
                          auVar35 = vfmadd231ps_fma(auVar198,auVar42,local_540);
                          auVar40 = vfmadd231ps_fma(auVar210,auVar42,local_550);
                          auVar42 = vfmadd231ps_fma(auVar166,auVar42,local_520);
                          auVar34 = vsubps_avx(auVar35,auVar34);
                          auVar35 = vsubps_avx(auVar40,auVar35);
                          auVar40 = vsubps_avx(auVar42,auVar40);
                          auVar211._0_4_ = fVar200 * auVar35._0_4_;
                          auVar211._4_4_ = fVar200 * auVar35._4_4_;
                          auVar211._8_4_ = fVar200 * auVar35._8_4_;
                          auVar211._12_4_ = fVar200 * auVar35._12_4_;
                          auVar156._4_4_ = auVar156._0_4_;
                          auVar156._8_4_ = auVar156._0_4_;
                          auVar156._12_4_ = auVar156._0_4_;
                          auVar34 = vfmadd231ps_fma(auVar211,auVar156,auVar34);
                          auVar167._0_4_ = fVar200 * auVar40._0_4_;
                          auVar167._4_4_ = fVar200 * auVar40._4_4_;
                          auVar167._8_4_ = fVar200 * auVar40._8_4_;
                          auVar167._12_4_ = fVar200 * auVar40._12_4_;
                          auVar35 = vfmadd231ps_fma(auVar167,auVar156,auVar35);
                          auVar168._0_4_ = fVar200 * auVar35._0_4_;
                          auVar168._4_4_ = fVar200 * auVar35._4_4_;
                          auVar168._8_4_ = fVar200 * auVar35._8_4_;
                          auVar168._12_4_ = fVar200 * auVar35._12_4_;
                          auVar34 = vfmadd231ps_fma(auVar168,auVar156,auVar34);
                          auVar93._0_16_ = vmulps_avx512vl(auVar34,auVar99);
                          pGVar5 = (context->scene->geometries).items[uVar22].ptr;
                          if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) {
                            bVar24 = false;
                          }
                          else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                  (bVar24 = true,
                                  pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                            auVar153._0_4_ = fVar202 * (float)local_5c0._0_4_;
                            auVar153._4_4_ = fVar202 * (float)local_5c0._4_4_;
                            auVar153._8_4_ = fVar202 * fStack_5b8;
                            auVar153._12_4_ = fVar202 * fStack_5b4;
                            auVar142._4_4_ = fVar199;
                            auVar142._0_4_ = fVar199;
                            auVar142._8_4_ = fVar199;
                            auVar142._12_4_ = fVar199;
                            auVar34 = vfmadd132ps_fma(auVar142,auVar153,local_5b0);
                            auVar134._4_4_ = fVar187;
                            auVar134._0_4_ = fVar187;
                            auVar134._8_4_ = fVar187;
                            auVar134._12_4_ = fVar187;
                            auVar34 = vfmadd132ps_fma(auVar134,auVar34,local_5a0);
                            auVar127._4_4_ = fVar203;
                            auVar127._0_4_ = fVar203;
                            auVar127._8_4_ = fVar203;
                            auVar127._12_4_ = fVar203;
                            auVar40 = vfmadd132ps_fma(auVar127,auVar34,local_590);
                            auVar34 = vshufps_avx(auVar40,auVar40,0xc9);
                            auVar35 = vshufps_avx(auVar93._0_16_,auVar93._0_16_,0xc9);
                            auVar128._0_4_ = auVar40._0_4_ * auVar35._0_4_;
                            auVar128._4_4_ = auVar40._4_4_ * auVar35._4_4_;
                            auVar128._8_4_ = auVar40._8_4_ * auVar35._8_4_;
                            auVar128._12_4_ = auVar40._12_4_ * auVar35._12_4_;
                            auVar34 = vfmsub231ps_fma(auVar128,auVar93._0_16_,auVar34);
                            local_200 = vbroadcastss_avx512f(auVar28);
                            auVar75 = vbroadcastss_avx512f(ZEXT416(1));
                            local_1c0 = vpermps_avx512f(auVar75,ZEXT1664(auVar28));
                            auVar75 = vpermps_avx512f(auVar75,ZEXT1664(auVar34));
                            auVar92 = vbroadcastss_avx512f(ZEXT416(2));
                            local_280 = vpermps_avx512f(auVar92,ZEXT1664(auVar34));
                            local_240 = vbroadcastss_avx512f(auVar34);
                            local_2c0[0] = (RTCHitN)auVar75[0];
                            local_2c0[1] = (RTCHitN)auVar75[1];
                            local_2c0[2] = (RTCHitN)auVar75[2];
                            local_2c0[3] = (RTCHitN)auVar75[3];
                            local_2c0[4] = (RTCHitN)auVar75[4];
                            local_2c0[5] = (RTCHitN)auVar75[5];
                            local_2c0[6] = (RTCHitN)auVar75[6];
                            local_2c0[7] = (RTCHitN)auVar75[7];
                            local_2c0[8] = (RTCHitN)auVar75[8];
                            local_2c0[9] = (RTCHitN)auVar75[9];
                            local_2c0[10] = (RTCHitN)auVar75[10];
                            local_2c0[0xb] = (RTCHitN)auVar75[0xb];
                            local_2c0[0xc] = (RTCHitN)auVar75[0xc];
                            local_2c0[0xd] = (RTCHitN)auVar75[0xd];
                            local_2c0[0xe] = (RTCHitN)auVar75[0xe];
                            local_2c0[0xf] = (RTCHitN)auVar75[0xf];
                            local_2c0[0x10] = (RTCHitN)auVar75[0x10];
                            local_2c0[0x11] = (RTCHitN)auVar75[0x11];
                            local_2c0[0x12] = (RTCHitN)auVar75[0x12];
                            local_2c0[0x13] = (RTCHitN)auVar75[0x13];
                            local_2c0[0x14] = (RTCHitN)auVar75[0x14];
                            local_2c0[0x15] = (RTCHitN)auVar75[0x15];
                            local_2c0[0x16] = (RTCHitN)auVar75[0x16];
                            local_2c0[0x17] = (RTCHitN)auVar75[0x17];
                            local_2c0[0x18] = (RTCHitN)auVar75[0x18];
                            local_2c0[0x19] = (RTCHitN)auVar75[0x19];
                            local_2c0[0x1a] = (RTCHitN)auVar75[0x1a];
                            local_2c0[0x1b] = (RTCHitN)auVar75[0x1b];
                            local_2c0[0x1c] = (RTCHitN)auVar75[0x1c];
                            local_2c0[0x1d] = (RTCHitN)auVar75[0x1d];
                            local_2c0[0x1e] = (RTCHitN)auVar75[0x1e];
                            local_2c0[0x1f] = (RTCHitN)auVar75[0x1f];
                            local_2c0[0x20] = (RTCHitN)auVar75[0x20];
                            local_2c0[0x21] = (RTCHitN)auVar75[0x21];
                            local_2c0[0x22] = (RTCHitN)auVar75[0x22];
                            local_2c0[0x23] = (RTCHitN)auVar75[0x23];
                            local_2c0[0x24] = (RTCHitN)auVar75[0x24];
                            local_2c0[0x25] = (RTCHitN)auVar75[0x25];
                            local_2c0[0x26] = (RTCHitN)auVar75[0x26];
                            local_2c0[0x27] = (RTCHitN)auVar75[0x27];
                            local_2c0[0x28] = (RTCHitN)auVar75[0x28];
                            local_2c0[0x29] = (RTCHitN)auVar75[0x29];
                            local_2c0[0x2a] = (RTCHitN)auVar75[0x2a];
                            local_2c0[0x2b] = (RTCHitN)auVar75[0x2b];
                            local_2c0[0x2c] = (RTCHitN)auVar75[0x2c];
                            local_2c0[0x2d] = (RTCHitN)auVar75[0x2d];
                            local_2c0[0x2e] = (RTCHitN)auVar75[0x2e];
                            local_2c0[0x2f] = (RTCHitN)auVar75[0x2f];
                            local_2c0[0x30] = (RTCHitN)auVar75[0x30];
                            local_2c0[0x31] = (RTCHitN)auVar75[0x31];
                            local_2c0[0x32] = (RTCHitN)auVar75[0x32];
                            local_2c0[0x33] = (RTCHitN)auVar75[0x33];
                            local_2c0[0x34] = (RTCHitN)auVar75[0x34];
                            local_2c0[0x35] = (RTCHitN)auVar75[0x35];
                            local_2c0[0x36] = (RTCHitN)auVar75[0x36];
                            local_2c0[0x37] = (RTCHitN)auVar75[0x37];
                            local_2c0[0x38] = (RTCHitN)auVar75[0x38];
                            local_2c0[0x39] = (RTCHitN)auVar75[0x39];
                            local_2c0[0x3a] = (RTCHitN)auVar75[0x3a];
                            local_2c0[0x3b] = (RTCHitN)auVar75[0x3b];
                            local_2c0[0x3c] = (RTCHitN)auVar75[0x3c];
                            local_2c0[0x3d] = (RTCHitN)auVar75[0x3d];
                            local_2c0[0x3e] = (RTCHitN)auVar75[0x3e];
                            local_2c0[0x3f] = (RTCHitN)auVar75[0x3f];
                            local_180 = local_300._0_8_;
                            uStack_178 = local_300._8_8_;
                            uStack_170 = local_300._16_8_;
                            uStack_168 = local_300._24_8_;
                            uStack_160 = local_300._32_8_;
                            uStack_158 = local_300._40_8_;
                            uStack_150 = local_300._48_8_;
                            uStack_148 = local_300._56_8_;
                            auVar75 = vmovdqa64_avx512f(local_340);
                            local_140 = vmovdqa64_avx512f(auVar75);
                            vpcmpeqd_avx2(auVar75._0_32_,auVar75._0_32_);
                            local_100 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                            local_c0 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                            *(float *)(ray + k * 4 + 0x200) = fVar201;
                            local_440 = local_380;
                            local_5f0.valid = (int *)local_440;
                            local_5f0.geometryUserPtr = pGVar5->userPtr;
                            local_5f0.context = context->user;
                            local_5f0.ray = (RTCRayN *)ray;
                            local_5f0.hit = local_2c0;
                            local_5f0.N = 0x10;
                            if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                              (*pGVar5->occlusionFilterN)(&local_5f0);
                              auVar28 = vxorps_avx512vl(auVar91._0_16_,auVar91._0_16_);
                              auVar240 = ZEXT1664(auVar28);
                              auVar236 = ZEXT464(0x3f800000);
                              auVar78._32_32_ = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                              in_ZMM19 = ZEXT3264(auVar78._32_32_);
                              auVar28 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                              auVar235 = ZEXT1664(auVar28);
                              auVar28 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                              auVar103 = ZEXT1664(auVar28);
                              auVar28 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                              auVar238 = ZEXT1664(auVar28);
                              auVar28 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                              auVar237 = ZEXT1664(auVar28);
                            }
                            auVar28 = auVar240._0_16_;
                            auVar93 = vmovdqa64_avx512f(local_440);
                            uVar9 = vptestmd_avx512f(auVar93,auVar93);
                            if ((short)uVar9 == 0) {
                              bVar24 = false;
                            }
                            else {
                              p_Var8 = context->args->filter;
                              if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                                (*p_Var8)(&local_5f0);
                                auVar28 = vxorps_avx512vl(auVar28,auVar28);
                                auVar240 = ZEXT1664(auVar28);
                                auVar236 = ZEXT464(0x3f800000);
                                auVar78._32_32_ = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                in_ZMM19 = ZEXT3264(auVar78._32_32_);
                                auVar28 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                auVar235 = ZEXT1664(auVar28);
                                auVar28 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                auVar103 = ZEXT1664(auVar28);
                                auVar28 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                auVar238 = ZEXT1664(auVar28);
                                auVar28 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                auVar237 = ZEXT1664(auVar28);
                              }
                              auVar75 = vmovdqa64_avx512f(local_440);
                              uVar20 = vptestmd_avx512f(auVar75,auVar75);
                              auVar75 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                              bVar24 = (bool)((byte)uVar20 & 1);
                              auVar93._0_4_ =
                                   (uint)bVar24 * auVar75._0_4_ |
                                   (uint)!bVar24 * *(int *)(local_5f0.ray + 0x200);
                              bVar24 = (bool)((byte)(uVar20 >> 1) & 1);
                              auVar93._4_4_ =
                                   (uint)bVar24 * auVar75._4_4_ |
                                   (uint)!bVar24 * *(int *)(local_5f0.ray + 0x204);
                              bVar24 = (bool)((byte)(uVar20 >> 2) & 1);
                              auVar93._8_4_ =
                                   (uint)bVar24 * auVar75._8_4_ |
                                   (uint)!bVar24 * *(int *)(local_5f0.ray + 0x208);
                              bVar24 = (bool)((byte)(uVar20 >> 3) & 1);
                              auVar93._12_4_ =
                                   (uint)bVar24 * auVar75._12_4_ |
                                   (uint)!bVar24 * *(int *)(local_5f0.ray + 0x20c);
                              bVar24 = (bool)((byte)(uVar20 >> 4) & 1);
                              auVar93._16_4_ =
                                   (uint)bVar24 * auVar75._16_4_ |
                                   (uint)!bVar24 * *(int *)(local_5f0.ray + 0x210);
                              bVar24 = (bool)((byte)(uVar20 >> 5) & 1);
                              auVar93._20_4_ =
                                   (uint)bVar24 * auVar75._20_4_ |
                                   (uint)!bVar24 * *(int *)(local_5f0.ray + 0x214);
                              bVar24 = (bool)((byte)(uVar20 >> 6) & 1);
                              auVar93._24_4_ =
                                   (uint)bVar24 * auVar75._24_4_ |
                                   (uint)!bVar24 * *(int *)(local_5f0.ray + 0x218);
                              bVar24 = (bool)((byte)(uVar20 >> 7) & 1);
                              auVar93._28_4_ =
                                   (uint)bVar24 * auVar75._28_4_ |
                                   (uint)!bVar24 * *(int *)(local_5f0.ray + 0x21c);
                              bVar24 = (bool)((byte)(uVar20 >> 8) & 1);
                              auVar93._32_4_ =
                                   (uint)bVar24 * auVar75._32_4_ |
                                   (uint)!bVar24 * *(int *)(local_5f0.ray + 0x220);
                              bVar24 = (bool)((byte)(uVar20 >> 9) & 1);
                              auVar93._36_4_ =
                                   (uint)bVar24 * auVar75._36_4_ |
                                   (uint)!bVar24 * *(int *)(local_5f0.ray + 0x224);
                              bVar24 = (bool)((byte)(uVar20 >> 10) & 1);
                              auVar93._40_4_ =
                                   (uint)bVar24 * auVar75._40_4_ |
                                   (uint)!bVar24 * *(int *)(local_5f0.ray + 0x228);
                              bVar24 = (bool)((byte)(uVar20 >> 0xb) & 1);
                              auVar93._44_4_ =
                                   (uint)bVar24 * auVar75._44_4_ |
                                   (uint)!bVar24 * *(int *)(local_5f0.ray + 0x22c);
                              bVar24 = (bool)((byte)(uVar20 >> 0xc) & 1);
                              auVar93._48_4_ =
                                   (uint)bVar24 * auVar75._48_4_ |
                                   (uint)!bVar24 * *(int *)(local_5f0.ray + 0x230);
                              bVar24 = (bool)((byte)(uVar20 >> 0xd) & 1);
                              auVar93._52_4_ =
                                   (uint)bVar24 * auVar75._52_4_ |
                                   (uint)!bVar24 * *(int *)(local_5f0.ray + 0x234);
                              bVar24 = (bool)((byte)(uVar20 >> 0xe) & 1);
                              auVar93._56_4_ =
                                   (uint)bVar24 * auVar75._56_4_ |
                                   (uint)!bVar24 * *(int *)(local_5f0.ray + 0x238);
                              bVar24 = SUB81(uVar20 >> 0xf,0);
                              auVar93._60_4_ =
                                   (uint)bVar24 * auVar75._60_4_ |
                                   (uint)!bVar24 * *(int *)(local_5f0.ray + 0x23c);
                              *(undefined1 (*) [64])(local_5f0.ray + 0x200) = auVar93;
                              bVar24 = (short)uVar20 != 0;
                            }
                            if (!bVar24) {
                              *(float *)(ray + k * 4 + 0x200) = fVar204;
                            }
                          }
                          auVar75 = ZEXT1664(auVar41);
                          bVar23 = (bool)(bVar23 | bVar24);
                        }
                      }
                    }
                  }
                  goto LAB_01b46ffb;
                }
                break;
              }
              lVar21 = lVar21 + -1;
            } while (lVar21 != 0);
          }
          auVar75 = ZEXT1664(auVar41);
        }
        else {
          auVar28 = vxorps_avx512vl(ZEXT416(5),auVar42);
          auVar240 = ZEXT1664(auVar28);
          auVar93._16_48_ = auVar80._16_48_;
          auVar93._0_16_ = auVar107;
        }
      }
LAB_01b46ffb:
      auVar78._32_32_ = auVar93._32_32_;
    } while (bVar11);
    auVar30 = vinsertps_avx512f(auVar94._0_16_,auVar30,0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_hn(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }